

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  byte bVar54;
  ulong uVar55;
  ulong uVar56;
  Geometry *geometry;
  long lVar57;
  long lVar58;
  bool bVar59;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  byte bVar63;
  float fVar64;
  float fVar124;
  float fVar126;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar65;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar130;
  float fVar131;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined4 uVar132;
  vint4 bi_2;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined8 uVar138;
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar149;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vint4 ai;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar167;
  float fVar169;
  vint4 ai_1;
  undefined1 auVar168 [16];
  vint4 ai_2;
  undefined1 auVar170 [32];
  float fVar171;
  uint uVar172;
  float fVar174;
  float fVar175;
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  RTCFilterFunctionNArguments args;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  LinearSpace3fa *local_530;
  Primitive *local_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined8 local_440;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [32];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar55 = (ulong)(byte)prim[1];
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 4 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 5 + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 6 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0xf + 6)));
  lVar62 = uVar55 * 0x25;
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0x11 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0x1a + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0x1b + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0x1c + 6)));
  uVar132 = *(undefined4 *)(prim + lVar62 + 0x12);
  auVar186._4_4_ = uVar132;
  auVar186._0_4_ = uVar132;
  auVar186._8_4_ = uVar132;
  auVar186._12_4_ = uVar132;
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar66 = vsubps_avx512vl(auVar79,*(undefined1 (*) [16])(prim + lVar62 + 6));
  fVar149 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar62 + 0x16)) *
            *(float *)(prim + lVar62 + 0x1a);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar55 * 7 + 6);
  auVar85 = vpmovsxwd_avx(auVar79);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar55 * 0xb + 6);
  auVar19 = vpmovsxwd_avx(auVar84);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar55 * 9 + 6);
  auVar20 = vpmovsxwd_avx(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar55 * 0xd + 6);
  auVar133 = vpmovsxwd_avx(auVar80);
  auVar67 = vpbroadcastd_avx512vl();
  auVar79 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar79 = vinsertps_avx512f(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar66 = vmulps_avx512vl(auVar186,auVar66);
  auVar68 = vmulps_avx512vl(auVar186,auVar79);
  auVar69 = vcvtdq2ps_avx512vl(auVar18);
  auVar70 = vcvtdq2ps_avx512vl(auVar75);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar72 = vcvtdq2ps_avx512vl(auVar72);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar79 = vcvtdq2ps_avx(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar76);
  auVar81 = vcvtdq2ps_avx(auVar77);
  auVar80 = vcvtdq2ps_avx(auVar78);
  uVar132 = auVar68._0_4_;
  auVar178._4_4_ = uVar132;
  auVar178._0_4_ = uVar132;
  auVar178._8_4_ = uVar132;
  auVar178._12_4_ = uVar132;
  auVar18 = vshufps_avx(auVar68,auVar68,0x55);
  auVar75 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar74 = vmulps_avx512vl(auVar75,auVar71);
  auVar139._0_4_ = auVar75._0_4_ * auVar79._0_4_;
  auVar139._4_4_ = auVar75._4_4_ * auVar79._4_4_;
  auVar139._8_4_ = auVar75._8_4_ * auVar79._8_4_;
  auVar139._12_4_ = auVar75._12_4_ * auVar79._12_4_;
  auVar68._0_4_ = auVar80._0_4_ * auVar75._0_4_;
  auVar68._4_4_ = auVar80._4_4_ * auVar75._4_4_;
  auVar68._8_4_ = auVar80._8_4_ * auVar75._8_4_;
  auVar68._12_4_ = auVar80._12_4_ * auVar75._12_4_;
  auVar75 = vfmadd231ps_avx512vl(auVar74,auVar18,auVar70);
  auVar74 = vfmadd231ps_avx512vl(auVar139,auVar18,auVar73);
  auVar18 = vfmadd231ps_fma(auVar68,auVar81,auVar18);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar178,auVar69);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar178,auVar72);
  auVar18 = vfmadd231ps_fma(auVar18,auVar84,auVar178);
  auVar76 = vbroadcastss_avx512vl(auVar66);
  auVar77 = vshufps_avx512vl(auVar66,auVar66,0x55);
  auVar78 = vshufps_avx512vl(auVar66,auVar66,0xaa);
  auVar71 = vmulps_avx512vl(auVar78,auVar71);
  auVar79 = vmulps_avx512vl(auVar78,auVar79);
  auVar80 = vmulps_avx512vl(auVar78,auVar80);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar77,auVar70);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar77,auVar73);
  auVar81 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar81);
  auVar69 = vfmadd231ps_avx512vl(auVar71,auVar76,auVar69);
  auVar70 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar72);
  auVar68 = vfmadd231ps_fma(auVar81,auVar76,auVar84);
  auVar185._8_4_ = 0x7fffffff;
  auVar185._0_8_ = 0x7fffffff7fffffff;
  auVar185._12_4_ = 0x7fffffff;
  auVar79 = vandps_avx(auVar185,auVar75);
  auVar182._8_4_ = 0x219392ef;
  auVar182._0_8_ = 0x219392ef219392ef;
  auVar182._12_4_ = 0x219392ef;
  uVar61 = vcmpps_avx512vl(auVar79,auVar182,1);
  bVar59 = (bool)((byte)uVar61 & 1);
  auVar66._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar75._0_4_;
  bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar75._4_4_;
  bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar75._8_4_;
  bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar75._12_4_;
  auVar79 = vandps_avx(auVar185,auVar74);
  uVar61 = vcmpps_avx512vl(auVar79,auVar182,1);
  bVar59 = (bool)((byte)uVar61 & 1);
  auVar82._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._0_4_;
  bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._4_4_;
  bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._8_4_;
  bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._12_4_;
  auVar79 = vandps_avx(auVar185,auVar18);
  uVar61 = vcmpps_avx512vl(auVar79,auVar182,1);
  bVar59 = (bool)((byte)uVar61 & 1);
  auVar83._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar18._0_4_;
  bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar18._4_4_;
  bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar18._8_4_;
  bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar18._12_4_;
  auVar84 = vrcp14ps_avx512vl(auVar66);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = 0x3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar79 = vfnmadd213ps_fma(auVar66,auVar84,auVar183);
  auVar80 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar79 = vfnmadd213ps_fma(auVar82,auVar84,auVar183);
  auVar78 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar83);
  auVar79 = vfnmadd213ps_fma(auVar83,auVar84,auVar183);
  auVar66 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar152._4_4_ = fVar149;
  auVar152._0_4_ = fVar149;
  auVar152._8_4_ = fVar149;
  auVar152._12_4_ = fVar149;
  auVar79 = vcvtdq2ps_avx(auVar85);
  auVar84 = vcvtdq2ps_avx(auVar19);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar85 = vfmadd213ps_fma(auVar84,auVar152,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar20);
  auVar84 = vcvtdq2ps_avx(auVar133);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar19 = vfmadd213ps_fma(auVar84,auVar152,auVar79);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar55 * 0x12 + 6);
  auVar79 = vpmovsxwd_avx(auVar18);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar55 * 0x16 + 6);
  auVar84 = vpmovsxwd_avx(auVar75);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar18 = vfmadd213ps_fma(auVar84,auVar152,auVar79);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar55 * 0x14 + 6);
  auVar79 = vpmovsxwd_avx(auVar71);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar55 * 0x18 + 6);
  auVar84 = vpmovsxwd_avx(auVar72);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar81 = vsubps_avx(auVar84,auVar79);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar55 * 0x1d + 6);
  auVar84 = vpmovsxwd_avx(auVar73);
  auVar81 = vfmadd213ps_fma(auVar81,auVar152,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar84);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar55 * 0x21 + 6);
  auVar84 = vpmovsxwd_avx(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar75 = vfmadd213ps_fma(auVar84,auVar152,auVar79);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar55 * 0x1f + 6);
  auVar79 = vpmovsxwd_avx(auVar76);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar55 * 0x23 + 6);
  auVar84 = vpmovsxwd_avx(auVar77);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar84 = vfmadd213ps_fma(auVar84,auVar152,auVar79);
  auVar79 = vsubps_avx(auVar85,auVar69);
  auVar153._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar153._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar153._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar153._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar19,auVar69);
  auVar145._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar145._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar145._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar145._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar18,auVar70);
  auVar168._0_4_ = auVar78._0_4_ * auVar79._0_4_;
  auVar168._4_4_ = auVar78._4_4_ * auVar79._4_4_;
  auVar168._8_4_ = auVar78._8_4_ * auVar79._8_4_;
  auVar168._12_4_ = auVar78._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar81,auVar70);
  auVar69._0_4_ = auVar78._0_4_ * auVar79._0_4_;
  auVar69._4_4_ = auVar78._4_4_ * auVar79._4_4_;
  auVar69._8_4_ = auVar78._8_4_ * auVar79._8_4_;
  auVar69._12_4_ = auVar78._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar75,auVar68);
  auVar70._0_4_ = auVar66._0_4_ * auVar79._0_4_;
  auVar70._4_4_ = auVar66._4_4_ * auVar79._4_4_;
  auVar70._8_4_ = auVar66._8_4_ * auVar79._8_4_;
  auVar70._12_4_ = auVar66._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar84,auVar68);
  auVar133._0_4_ = auVar66._0_4_ * auVar79._0_4_;
  auVar133._4_4_ = auVar66._4_4_ * auVar79._4_4_;
  auVar133._8_4_ = auVar66._8_4_ * auVar79._8_4_;
  auVar133._12_4_ = auVar66._12_4_ * auVar79._12_4_;
  auVar79 = vpminsd_avx(auVar153,auVar145);
  auVar84 = vpminsd_avx(auVar168,auVar69);
  auVar79 = vmaxps_avx(auVar79,auVar84);
  auVar84 = vpminsd_avx(auVar70,auVar133);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar78._4_4_ = uVar132;
  auVar78._0_4_ = uVar132;
  auVar78._8_4_ = uVar132;
  auVar78._12_4_ = uVar132;
  auVar84 = vmaxps_avx512vl(auVar84,auVar78);
  auVar79 = vmaxps_avx(auVar79,auVar84);
  auVar85._8_4_ = 0x3f7ffffa;
  auVar85._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar85._12_4_ = 0x3f7ffffa;
  local_3d0 = vmulps_avx512vl(auVar79,auVar85);
  auVar79 = vpmaxsd_avx(auVar153,auVar145);
  auVar84 = vpmaxsd_avx(auVar168,auVar69);
  auVar79 = vminps_avx(auVar79,auVar84);
  auVar84 = vpmaxsd_avx(auVar70,auVar133);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar19._4_4_ = uVar132;
  auVar19._0_4_ = uVar132;
  auVar19._8_4_ = uVar132;
  auVar19._12_4_ = uVar132;
  auVar84 = vminps_avx512vl(auVar84,auVar19);
  auVar79 = vminps_avx(auVar79,auVar84);
  auVar20._8_4_ = 0x3f800003;
  auVar20._0_8_ = 0x3f8000033f800003;
  auVar20._12_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar20);
  uVar138 = vcmpps_avx512vl(local_3d0,auVar79,2);
  uVar21 = vpcmpgtd_avx512vl(auVar67,_DAT_01f4ad30);
  uVar61 = (ulong)((byte)uVar138 & 0xf & (byte)uVar21);
  local_530 = pre->ray_space + k;
  local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_528 = prim;
  for (; uVar61 != 0; uVar61 = (ulong)((uint)uVar61 & (uint)uVar61 + 0xf & (uint)uVar138)) {
    lVar62 = 0;
    for (uVar55 = uVar61; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      lVar62 = lVar62 + 1;
    }
    uVar6 = *(uint *)(local_528 + 2);
    pGVar8 = (context->scene->geometries).items[uVar6].ptr;
    uVar55 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)*(uint *)(local_528 + lVar62 * 4 + 6) *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    fVar149 = (pGVar8->time_range).lower;
    fVar149 = pGVar8->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar149) / ((pGVar8->time_range).upper - fVar149));
    auVar79 = vroundss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),9);
    auVar79 = vminss_avx(auVar79,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
    auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,auVar79);
    fVar149 = fVar149 - auVar79._0_4_;
    _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar58 = (long)(int)auVar79._0_4_ * 0x38;
    lVar62 = *(long *)(_Var9 + 0x10 + lVar58);
    lVar57 = *(long *)(_Var9 + 0x38 + lVar58);
    lVar10 = *(long *)(_Var9 + 0x48 + lVar58);
    auVar140._4_4_ = fVar149;
    auVar140._0_4_ = fVar149;
    auVar140._8_4_ = fVar149;
    auVar140._12_4_ = fVar149;
    pfVar3 = (float *)(lVar57 + uVar55 * lVar10);
    auVar180._0_4_ = fVar149 * *pfVar3;
    auVar180._4_4_ = fVar149 * pfVar3[1];
    auVar180._8_4_ = fVar149 * pfVar3[2];
    auVar180._12_4_ = fVar149 * pfVar3[3];
    pfVar3 = (float *)(lVar57 + (uVar55 + 1) * lVar10);
    auVar181._0_4_ = fVar149 * *pfVar3;
    auVar181._4_4_ = fVar149 * pfVar3[1];
    auVar181._8_4_ = fVar149 * pfVar3[2];
    auVar181._12_4_ = fVar149 * pfVar3[3];
    auVar79 = vmulps_avx512vl(auVar140,*(undefined1 (*) [16])(lVar57 + (uVar55 + 2) * lVar10));
    auVar84 = vmulps_avx512vl(auVar140,*(undefined1 (*) [16])(lVar57 + lVar10 * (uVar55 + 3)));
    lVar57 = *(long *)(_Var9 + lVar58);
    fVar149 = 1.0 - fVar149;
    auVar67._4_4_ = fVar149;
    auVar67._0_4_ = fVar149;
    auVar67._8_4_ = fVar149;
    auVar67._12_4_ = fVar149;
    local_5f0 = vfmadd231ps_fma(auVar180,auVar67,*(undefined1 (*) [16])(lVar57 + lVar62 * uVar55));
    local_600 = vfmadd231ps_fma(auVar181,auVar67,
                                *(undefined1 (*) [16])(lVar57 + lVar62 * (uVar55 + 1)));
    local_610 = vfmadd231ps_avx512vl
                          (auVar79,auVar67,*(undefined1 (*) [16])(lVar57 + lVar62 * (uVar55 + 2)));
    _local_470 = vfmadd231ps_avx512vl
                           (auVar84,auVar67,*(undefined1 (*) [16])(lVar57 + lVar62 * (uVar55 + 3)));
    iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar81 = vsubps_avx(local_5f0,auVar79);
    uVar132 = auVar81._0_4_;
    auVar146._4_4_ = uVar132;
    auVar146._0_4_ = uVar132;
    auVar146._8_4_ = uVar132;
    auVar146._12_4_ = uVar132;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    aVar4 = (local_530->vx).field_0;
    aVar5 = (local_530->vy).field_0;
    fVar149 = (local_530->vz).field_0.m128[0];
    fVar171 = *(float *)((long)&(local_530->vz).field_0 + 4);
    fVar174 = *(float *)((long)&(local_530->vz).field_0 + 8);
    fVar175 = *(float *)((long)&(local_530->vz).field_0 + 0xc);
    auVar173._0_4_ = fVar149 * auVar81._0_4_;
    auVar173._4_4_ = fVar171 * auVar81._4_4_;
    auVar173._8_4_ = fVar174 * auVar81._8_4_;
    auVar173._12_4_ = fVar175 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar5,auVar84);
    auVar80 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar146);
    auVar81 = vsubps_avx(local_600,auVar79);
    uVar132 = auVar81._0_4_;
    auVar147._4_4_ = uVar132;
    auVar147._0_4_ = uVar132;
    auVar147._8_4_ = uVar132;
    auVar147._12_4_ = uVar132;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar176._0_4_ = fVar149 * auVar81._0_4_;
    auVar176._4_4_ = fVar171 * auVar81._4_4_;
    auVar176._8_4_ = fVar174 * auVar81._8_4_;
    auVar176._12_4_ = fVar175 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar5,auVar84);
    auVar18 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar147);
    auVar81 = vsubps_avx512vl(local_610,auVar79);
    uVar132 = auVar81._0_4_;
    auVar148._4_4_ = uVar132;
    auVar148._0_4_ = uVar132;
    auVar148._8_4_ = uVar132;
    auVar148._12_4_ = uVar132;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar179._0_4_ = fVar149 * auVar81._0_4_;
    auVar179._4_4_ = fVar171 * auVar81._4_4_;
    auVar179._8_4_ = fVar174 * auVar81._8_4_;
    auVar179._12_4_ = fVar175 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar84);
    auVar75 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar148);
    auVar84 = vsubps_avx512vl(_local_470,auVar79);
    uVar132 = auVar84._0_4_;
    auVar141._4_4_ = uVar132;
    auVar141._0_4_ = uVar132;
    auVar141._8_4_ = uVar132;
    auVar141._12_4_ = uVar132;
    auVar79 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar184._0_4_ = fVar149 * auVar84._0_4_;
    auVar184._4_4_ = fVar171 * auVar84._4_4_;
    auVar184._8_4_ = fVar174 * auVar84._8_4_;
    auVar184._12_4_ = fVar175 * auVar84._12_4_;
    auVar79 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar5,auVar79);
    auVar71 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar141);
    lVar62 = (long)iVar7 * 0x44;
    auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar62);
    uVar132 = auVar80._0_4_;
    local_4e0._4_4_ = uVar132;
    local_4e0._0_4_ = uVar132;
    local_4e0._8_4_ = uVar132;
    local_4e0._12_4_ = uVar132;
    local_4e0._16_4_ = uVar132;
    local_4e0._20_4_ = uVar132;
    local_4e0._24_4_ = uVar132;
    local_4e0._28_4_ = uVar132;
    auVar86._8_4_ = 1;
    auVar86._0_8_ = 0x100000001;
    auVar86._12_4_ = 1;
    auVar86._16_4_ = 1;
    auVar86._20_4_ = 1;
    auVar86._24_4_ = 1;
    auVar86._28_4_ = 1;
    local_4c0 = vpermps_avx2(auVar86,ZEXT1632(auVar80));
    auVar101 = *(undefined1 (*) [32])(bspline_basis0 + lVar62 + 0x484);
    uVar132 = auVar18._0_4_;
    local_640._4_4_ = uVar132;
    local_640._0_4_ = uVar132;
    local_640._8_4_ = uVar132;
    local_640._12_4_ = uVar132;
    local_640._16_4_ = uVar132;
    local_640._20_4_ = uVar132;
    local_640._24_4_ = uVar132;
    local_640._28_4_ = uVar132;
    local_660 = vpermps_avx512vl(auVar86,ZEXT1632(auVar18));
    auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar62 + 0x908);
    local_5a0 = vbroadcastss_avx512vl(auVar75);
    local_500 = vpermps_avx512vl(auVar86,ZEXT1632(auVar75));
    auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar62 + 0xd8c);
    local_5c0 = vbroadcastss_avx512vl(auVar71);
    auVar196 = ZEXT3264(local_5c0);
    local_5e0 = vpermps_avx512vl(auVar86,ZEXT1632(auVar71));
    auVar198 = ZEXT3264(local_5e0);
    auVar86 = vmulps_avx512vl(local_5c0,auVar98);
    auVar87 = vmulps_avx512vl(local_5e0,auVar98);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar99,local_5a0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar99,local_500);
    auVar79 = vfmadd231ps_fma(auVar86,auVar101,local_640);
    auVar86 = vfmadd231ps_avx512vl(auVar87,auVar101,local_660);
    auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar100,local_4e0);
    auVar89 = vfmadd231ps_avx512vl(auVar86,auVar100,local_4c0);
    auVar86 = *(undefined1 (*) [32])(bspline_basis1 + lVar62);
    auVar87 = *(undefined1 (*) [32])(bspline_basis1 + lVar62 + 0x484);
    auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar62 + 0x908);
    auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar62 + 0xd8c);
    auVar90 = vmulps_avx512vl(local_5c0,auVar96);
    auVar91 = vmulps_avx512vl(local_5e0,auVar96);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar97,local_5a0);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar97,local_500);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar87,local_640);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,local_660);
    auVar72 = vfmadd231ps_fma(auVar90,auVar86,local_4e0);
    auVar73 = vfmadd231ps_fma(auVar91,auVar86,local_4c0);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar72),auVar88);
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar73),auVar89);
    auVar92 = vmulps_avx512vl(auVar89,auVar90);
    auVar93 = vmulps_avx512vl(auVar88,auVar91);
    auVar92 = vsubps_avx512vl(auVar92,auVar93);
    auVar79 = vshufps_avx(local_5f0,local_5f0,0xff);
    uVar138 = auVar79._0_8_;
    local_80._8_8_ = uVar138;
    local_80._0_8_ = uVar138;
    local_80._16_8_ = uVar138;
    local_80._24_8_ = uVar138;
    auVar79 = vshufps_avx(local_600,local_600,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar79);
    auVar79 = vshufps_avx512vl(local_610,local_610,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar79);
    auVar79 = vshufps_avx512vl(_local_470,_local_470,0xff);
    uVar138 = auVar79._0_8_;
    register0x000012c8 = uVar138;
    local_e0 = uVar138;
    register0x000012d0 = uVar138;
    register0x000012d8 = uVar138;
    auVar93 = vmulps_avx512vl(_local_e0,auVar98);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,local_c0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar101,local_a0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,local_80);
    auVar94 = vmulps_avx512vl(_local_e0,auVar96);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,local_c0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar87,local_a0);
    auVar74 = vfmadd231ps_fma(auVar94,auVar86,local_80);
    auVar94 = vmulps_avx512vl(auVar91,auVar91);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar90);
    auVar95 = vmaxps_avx512vl(auVar93,ZEXT1632(auVar74));
    auVar95 = vmulps_avx512vl(auVar95,auVar95);
    auVar94 = vmulps_avx512vl(auVar95,auVar94);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    uVar138 = vcmpps_avx512vl(auVar92,auVar94,2);
    auVar79 = vblendps_avx(auVar80,local_5f0,8);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar84 = vandps_avx512vl(auVar79,auVar81);
    auVar79 = vblendps_avx(auVar18,local_600,8);
    auVar79 = vandps_avx512vl(auVar79,auVar81);
    auVar84 = vmaxps_avx(auVar84,auVar79);
    auVar79 = vblendps_avx(auVar75,local_610,8);
    auVar76 = vandps_avx512vl(auVar79,auVar81);
    auVar79 = vblendps_avx(auVar71,_local_470,8);
    auVar79 = vandps_avx512vl(auVar79,auVar81);
    auVar79 = vmaxps_avx(auVar76,auVar79);
    auVar79 = vmaxps_avx(auVar84,auVar79);
    auVar84 = vmovshdup_avx(auVar79);
    auVar84 = vmaxss_avx(auVar84,auVar79);
    auVar79 = vshufpd_avx(auVar79,auVar79,1);
    auVar81 = vcvtsi2ss_avx512f(_local_470,iVar7);
    auVar79 = vmaxss_avx(auVar79,auVar84);
    local_400._0_16_ = auVar81;
    fVar149 = auVar81._0_4_;
    auVar94._4_4_ = fVar149;
    auVar94._0_4_ = fVar149;
    auVar94._8_4_ = fVar149;
    auVar94._12_4_ = fVar149;
    auVar94._16_4_ = fVar149;
    auVar94._20_4_ = fVar149;
    auVar94._24_4_ = fVar149;
    auVar94._28_4_ = fVar149;
    uVar21 = vcmpps_avx512vl(auVar94,_DAT_01f7b060,0xe);
    bVar63 = (byte)uVar138 & (byte)uVar21;
    auVar79 = vmulss_avx512f(auVar79,ZEXT416(0x35000000));
    auVar92._8_4_ = 2;
    auVar92._0_8_ = 0x200000002;
    auVar92._12_4_ = 2;
    auVar92._16_4_ = 2;
    auVar92._20_4_ = 2;
    auVar92._24_4_ = 2;
    auVar92._28_4_ = 2;
    local_100 = vpermps_avx512vl(auVar92,ZEXT1632(auVar80));
    local_120 = vpermps_avx512vl(auVar92,ZEXT1632(auVar18));
    local_140 = vpermps_avx512vl(auVar92,ZEXT1632(auVar75));
    local_580 = vpermps_avx2(auVar92,ZEXT1632(auVar71));
    local_280 = vpbroadcastd_avx512vl();
    uVar172 = *(uint *)(ray + k * 4 + 0x60);
    auVar84 = local_100._0_16_;
    if (bVar63 == 0) {
      bVar59 = false;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar191 = ZEXT3264(auVar100);
      auVar84 = vxorps_avx512vl(auVar84,auVar84);
      auVar192 = ZEXT1664(auVar84);
      auVar193 = ZEXT3264(local_4e0);
      auVar194 = ZEXT3264(local_4c0);
      auVar190 = ZEXT3264(local_640);
      auVar189 = ZEXT3264(local_660);
      auVar195 = ZEXT3264(local_5a0);
      auVar197 = ZEXT3264(local_500);
    }
    else {
      local_520._0_16_ = ZEXT416(uVar172);
      local_4a0._0_16_ = auVar79;
      auVar96 = vmulps_avx512vl(local_580,auVar96);
      auVar97 = vfmadd213ps_avx512vl(auVar97,local_140,auVar96);
      auVar87 = vfmadd213ps_avx512vl(auVar87,local_120,auVar97);
      auVar96 = vfmadd213ps_avx512vl(auVar86,local_100,auVar87);
      auVar98 = vmulps_avx512vl(local_580,auVar98);
      auVar99 = vfmadd213ps_avx512vl(auVar99,local_140,auVar98);
      auVar87 = vfmadd213ps_avx512vl(auVar101,local_120,auVar99);
      auVar101 = *(undefined1 (*) [32])(bspline_basis0 + lVar62 + 0x1210);
      auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar62 + 0x1694);
      auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar62 + 0x1b18);
      auVar86 = *(undefined1 (*) [32])(bspline_basis0 + lVar62 + 0x1f9c);
      auVar92 = vfmadd213ps_avx512vl(auVar100,local_100,auVar87);
      auVar100 = vmulps_avx512vl(local_5c0,auVar86);
      auVar87 = vmulps_avx512vl(local_5e0,auVar86);
      auVar86 = vmulps_avx512vl(local_580,auVar86);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_5a0);
      auVar81 = vfmadd231ps_fma(auVar87,auVar98,local_500);
      auVar98 = vfmadd231ps_avx512vl(auVar86,local_140,auVar98);
      auVar80 = vfmadd231ps_fma(auVar100,auVar99,local_640);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar99,local_660);
      auVar86 = vfmadd231ps_avx512vl(auVar98,local_120,auVar99);
      auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar101,local_4e0);
      auVar97 = vfmadd231ps_avx512vl(auVar100,auVar101,local_4c0);
      auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar62 + 0x1210);
      auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar62 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar62 + 0x1f9c);
      auVar86 = vfmadd231ps_avx512vl(auVar86,local_100,auVar101);
      auVar101 = vmulps_avx512vl(local_5c0,auVar98);
      auVar94 = vmulps_avx512vl(local_5e0,auVar98);
      auVar98 = vmulps_avx512vl(local_580,auVar98);
      auVar199 = ZEXT1664(auVar79);
      auVar95 = vfmadd231ps_avx512vl(auVar101,auVar99,local_5a0);
      auVar81 = vfmadd231ps_fma(auVar94,auVar99,local_500);
      auVar197 = ZEXT3264(local_500);
      auVar99 = vfmadd231ps_avx512vl(auVar98,local_140,auVar99);
      auVar101 = *(undefined1 (*) [32])(bspline_basis1 + lVar62 + 0x1694);
      auVar98 = vfmadd231ps_avx512vl(auVar95,auVar101,local_640);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar101,local_660);
      auVar101 = vfmadd231ps_avx512vl(auVar99,local_120,auVar101);
      auVar99 = vfmadd231ps_avx512vl(auVar98,auVar100,local_4e0);
      auVar98 = vfmadd231ps_avx512vl(auVar94,auVar100,local_4c0);
      auVar94 = vfmadd231ps_avx512vl(auVar101,local_100,auVar100);
      auVar187._8_4_ = 0x7fffffff;
      auVar187._0_8_ = 0x7fffffff7fffffff;
      auVar187._12_4_ = 0x7fffffff;
      auVar187._16_4_ = 0x7fffffff;
      auVar187._20_4_ = 0x7fffffff;
      auVar187._24_4_ = 0x7fffffff;
      auVar187._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(auVar87,auVar187);
      auVar101 = vandps_avx(auVar97,auVar187);
      auVar101 = vmaxps_avx(auVar100,auVar101);
      auVar100 = vandps_avx(auVar86,auVar187);
      auVar100 = vmaxps_avx(auVar101,auVar100);
      auVar86 = vbroadcastss_avx512vl(auVar79);
      uVar55 = vcmpps_avx512vl(auVar100,auVar86,1);
      bVar59 = (bool)((byte)uVar55 & 1);
      auVar95._0_4_ = (float)((uint)bVar59 * auVar90._0_4_ | (uint)!bVar59 * auVar87._0_4_);
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar95._4_4_ = (float)((uint)bVar59 * auVar90._4_4_ | (uint)!bVar59 * auVar87._4_4_);
      bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar95._8_4_ = (float)((uint)bVar59 * auVar90._8_4_ | (uint)!bVar59 * auVar87._8_4_);
      bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar95._12_4_ = (float)((uint)bVar59 * auVar90._12_4_ | (uint)!bVar59 * auVar87._12_4_);
      bVar59 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar95._16_4_ = (float)((uint)bVar59 * auVar90._16_4_ | (uint)!bVar59 * auVar87._16_4_);
      bVar59 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar95._20_4_ = (float)((uint)bVar59 * auVar90._20_4_ | (uint)!bVar59 * auVar87._20_4_);
      bVar59 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar95._24_4_ = (float)((uint)bVar59 * auVar90._24_4_ | (uint)!bVar59 * auVar87._24_4_);
      bVar59 = SUB81(uVar55 >> 7,0);
      auVar95._28_4_ = (uint)bVar59 * auVar90._28_4_ | (uint)!bVar59 * auVar87._28_4_;
      bVar59 = (bool)((byte)uVar55 & 1);
      auVar112._0_4_ = (float)((uint)bVar59 * auVar91._0_4_ | (uint)!bVar59 * auVar97._0_4_);
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar59 * auVar91._4_4_ | (uint)!bVar59 * auVar97._4_4_);
      bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar59 * auVar91._8_4_ | (uint)!bVar59 * auVar97._8_4_);
      bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar59 * auVar91._12_4_ | (uint)!bVar59 * auVar97._12_4_);
      bVar59 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar59 * auVar91._16_4_ | (uint)!bVar59 * auVar97._16_4_);
      bVar59 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar59 * auVar91._20_4_ | (uint)!bVar59 * auVar97._20_4_);
      bVar59 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar59 * auVar91._24_4_ | (uint)!bVar59 * auVar97._24_4_);
      bVar59 = SUB81(uVar55 >> 7,0);
      auVar112._28_4_ = (uint)bVar59 * auVar91._28_4_ | (uint)!bVar59 * auVar97._28_4_;
      auVar100 = vandps_avx(auVar187,auVar99);
      auVar101 = vandps_avx(auVar98,auVar187);
      auVar101 = vmaxps_avx(auVar100,auVar101);
      auVar100 = vandps_avx(auVar94,auVar187);
      auVar100 = vmaxps_avx(auVar101,auVar100);
      uVar55 = vcmpps_avx512vl(auVar100,auVar86,1);
      bVar59 = (bool)((byte)uVar55 & 1);
      auVar102._0_4_ = (float)((uint)bVar59 * auVar90._0_4_ | (uint)!bVar59 * auVar99._0_4_);
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar102._4_4_ = (float)((uint)bVar59 * auVar90._4_4_ | (uint)!bVar59 * auVar99._4_4_);
      bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar102._8_4_ = (float)((uint)bVar59 * auVar90._8_4_ | (uint)!bVar59 * auVar99._8_4_);
      bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar102._12_4_ = (float)((uint)bVar59 * auVar90._12_4_ | (uint)!bVar59 * auVar99._12_4_);
      bVar59 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar102._16_4_ = (float)((uint)bVar59 * auVar90._16_4_ | (uint)!bVar59 * auVar99._16_4_);
      bVar59 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar102._20_4_ = (float)((uint)bVar59 * auVar90._20_4_ | (uint)!bVar59 * auVar99._20_4_);
      bVar59 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar102._24_4_ = (float)((uint)bVar59 * auVar90._24_4_ | (uint)!bVar59 * auVar99._24_4_);
      bVar59 = SUB81(uVar55 >> 7,0);
      auVar102._28_4_ = (uint)bVar59 * auVar90._28_4_ | (uint)!bVar59 * auVar99._28_4_;
      bVar59 = (bool)((byte)uVar55 & 1);
      auVar103._0_4_ = (float)((uint)bVar59 * auVar91._0_4_ | (uint)!bVar59 * auVar98._0_4_);
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar59 * auVar91._4_4_ | (uint)!bVar59 * auVar98._4_4_);
      bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar59 * auVar91._8_4_ | (uint)!bVar59 * auVar98._8_4_);
      bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar59 * auVar91._12_4_ | (uint)!bVar59 * auVar98._12_4_);
      bVar59 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar103._16_4_ = (float)((uint)bVar59 * auVar91._16_4_ | (uint)!bVar59 * auVar98._16_4_);
      bVar59 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar103._20_4_ = (float)((uint)bVar59 * auVar91._20_4_ | (uint)!bVar59 * auVar98._20_4_);
      bVar59 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar103._24_4_ = (float)((uint)bVar59 * auVar91._24_4_ | (uint)!bVar59 * auVar98._24_4_);
      bVar59 = SUB81(uVar55 >> 7,0);
      auVar103._28_4_ = (uint)bVar59 * auVar91._28_4_ | (uint)!bVar59 * auVar98._28_4_;
      auVar85 = vxorps_avx512vl(auVar84,auVar84);
      auVar192 = ZEXT1664(auVar85);
      auVar100 = vfmadd213ps_avx512vl(auVar95,auVar95,ZEXT1632(auVar85));
      auVar84 = vfmadd231ps_fma(auVar100,auVar112,auVar112);
      auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar171 = auVar99._0_4_;
      fVar174 = auVar99._4_4_;
      fVar175 = auVar99._8_4_;
      fVar167 = auVar99._12_4_;
      fVar166 = auVar99._16_4_;
      fVar169 = auVar99._20_4_;
      fVar64 = auVar99._24_4_;
      auVar100._4_4_ = fVar174 * fVar174 * fVar174 * auVar84._4_4_ * -0.5;
      auVar100._0_4_ = fVar171 * fVar171 * fVar171 * auVar84._0_4_ * -0.5;
      auVar100._8_4_ = fVar175 * fVar175 * fVar175 * auVar84._8_4_ * -0.5;
      auVar100._12_4_ = fVar167 * fVar167 * fVar167 * auVar84._12_4_ * -0.5;
      auVar100._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
      auVar100._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
      auVar100._24_4_ = fVar64 * fVar64 * fVar64 * -0.0;
      auVar100._28_4_ = 0;
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar86,auVar99);
      auVar101._4_4_ = auVar112._4_4_ * auVar100._4_4_;
      auVar101._0_4_ = auVar112._0_4_ * auVar100._0_4_;
      auVar101._8_4_ = auVar112._8_4_ * auVar100._8_4_;
      auVar101._12_4_ = auVar112._12_4_ * auVar100._12_4_;
      auVar101._16_4_ = auVar112._16_4_ * auVar100._16_4_;
      auVar101._20_4_ = auVar112._20_4_ * auVar100._20_4_;
      auVar101._24_4_ = auVar112._24_4_ * auVar100._24_4_;
      auVar101._28_4_ = auVar99._28_4_;
      auVar99._4_4_ = auVar100._4_4_ * -auVar95._4_4_;
      auVar99._0_4_ = auVar100._0_4_ * -auVar95._0_4_;
      auVar99._8_4_ = auVar100._8_4_ * -auVar95._8_4_;
      auVar99._12_4_ = auVar100._12_4_ * -auVar95._12_4_;
      auVar99._16_4_ = auVar100._16_4_ * -auVar95._16_4_;
      auVar99._20_4_ = auVar100._20_4_ * -auVar95._20_4_;
      auVar99._24_4_ = auVar100._24_4_ * -auVar95._24_4_;
      auVar99._28_4_ = auVar95._28_4_ ^ 0x80000000;
      auVar90 = vmulps_avx512vl(auVar100,ZEXT1632(auVar85));
      auVar91 = ZEXT1632(auVar85);
      auVar98 = vfmadd213ps_avx512vl(auVar102,auVar102,auVar91);
      auVar84 = vfmadd231ps_fma(auVar98,auVar103,auVar103);
      auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar171 = auVar97._0_4_;
      fVar174 = auVar97._4_4_;
      fVar175 = auVar97._8_4_;
      fVar167 = auVar97._12_4_;
      fVar166 = auVar97._16_4_;
      fVar169 = auVar97._20_4_;
      fVar64 = auVar97._24_4_;
      auVar98._4_4_ = fVar174 * fVar174 * fVar174 * auVar84._4_4_ * -0.5;
      auVar98._0_4_ = fVar171 * fVar171 * fVar171 * auVar84._0_4_ * -0.5;
      auVar98._8_4_ = fVar175 * fVar175 * fVar175 * auVar84._8_4_ * -0.5;
      auVar98._12_4_ = fVar167 * fVar167 * fVar167 * auVar84._12_4_ * -0.5;
      auVar98._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
      auVar98._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
      auVar98._24_4_ = fVar64 * fVar64 * fVar64 * -0.0;
      auVar98._28_4_ = 0;
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar86,auVar97);
      auVar87._4_4_ = auVar103._4_4_ * auVar98._4_4_;
      auVar87._0_4_ = auVar103._0_4_ * auVar98._0_4_;
      auVar87._8_4_ = auVar103._8_4_ * auVar98._8_4_;
      auVar87._12_4_ = auVar103._12_4_ * auVar98._12_4_;
      auVar87._16_4_ = auVar103._16_4_ * auVar98._16_4_;
      auVar87._20_4_ = auVar103._20_4_ * auVar98._20_4_;
      auVar87._24_4_ = auVar103._24_4_ * auVar98._24_4_;
      auVar87._28_4_ = auVar97._28_4_;
      auVar97._4_4_ = -auVar102._4_4_ * auVar98._4_4_;
      auVar97._0_4_ = -auVar102._0_4_ * auVar98._0_4_;
      auVar97._8_4_ = -auVar102._8_4_ * auVar98._8_4_;
      auVar97._12_4_ = -auVar102._12_4_ * auVar98._12_4_;
      auVar97._16_4_ = -auVar102._16_4_ * auVar98._16_4_;
      auVar97._20_4_ = -auVar102._20_4_ * auVar98._20_4_;
      auVar97._24_4_ = -auVar102._24_4_ * auVar98._24_4_;
      auVar97._28_4_ = auVar100._28_4_;
      auVar100 = vmulps_avx512vl(auVar98,auVar91);
      auVar84 = vfmadd213ps_fma(auVar101,auVar93,auVar88);
      auVar81 = vfmadd213ps_fma(auVar99,auVar93,auVar89);
      auVar98 = vfmadd213ps_avx512vl(auVar90,auVar93,auVar92);
      auVar86 = vfmadd213ps_avx512vl(auVar87,ZEXT1632(auVar74),ZEXT1632(auVar72));
      auVar76 = vfnmadd213ps_fma(auVar101,auVar93,auVar88);
      auVar88 = ZEXT1632(auVar74);
      auVar80 = vfmadd213ps_fma(auVar97,auVar88,ZEXT1632(auVar73));
      auVar77 = vfnmadd213ps_fma(auVar99,auVar93,auVar89);
      auVar18 = vfmadd213ps_fma(auVar100,auVar88,auVar96);
      auVar101 = vfnmadd231ps_avx512vl(auVar92,auVar93,auVar90);
      auVar72 = vfnmadd213ps_fma(auVar87,auVar88,ZEXT1632(auVar72));
      auVar73 = vfnmadd213ps_fma(auVar97,auVar88,ZEXT1632(auVar73));
      auVar78 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar74),auVar100);
      auVar99 = vsubps_avx512vl(auVar86,ZEXT1632(auVar76));
      auVar100 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar77));
      auVar87 = vsubps_avx512vl(ZEXT1632(auVar18),auVar101);
      auVar97 = vmulps_avx512vl(auVar100,auVar101);
      auVar75 = vfmsub231ps_fma(auVar97,ZEXT1632(auVar77),auVar87);
      auVar96._4_4_ = auVar76._4_4_ * auVar87._4_4_;
      auVar96._0_4_ = auVar76._0_4_ * auVar87._0_4_;
      auVar96._8_4_ = auVar76._8_4_ * auVar87._8_4_;
      auVar96._12_4_ = auVar76._12_4_ * auVar87._12_4_;
      auVar96._16_4_ = auVar87._16_4_ * 0.0;
      auVar96._20_4_ = auVar87._20_4_ * 0.0;
      auVar96._24_4_ = auVar87._24_4_ * 0.0;
      auVar96._28_4_ = auVar87._28_4_;
      auVar87 = vfmsub231ps_avx512vl(auVar96,auVar101,auVar99);
      auVar88._4_4_ = auVar77._4_4_ * auVar99._4_4_;
      auVar88._0_4_ = auVar77._0_4_ * auVar99._0_4_;
      auVar88._8_4_ = auVar77._8_4_ * auVar99._8_4_;
      auVar88._12_4_ = auVar77._12_4_ * auVar99._12_4_;
      auVar88._16_4_ = auVar99._16_4_ * 0.0;
      auVar88._20_4_ = auVar99._20_4_ * 0.0;
      auVar88._24_4_ = auVar99._24_4_ * 0.0;
      auVar88._28_4_ = auVar99._28_4_;
      auVar71 = vfmsub231ps_fma(auVar88,ZEXT1632(auVar76),auVar100);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar91,auVar87);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar91,ZEXT1632(auVar75));
      auVar92 = ZEXT1632(auVar85);
      uVar55 = vcmpps_avx512vl(auVar100,auVar92,2);
      bVar54 = (byte)uVar55;
      fVar64 = (float)((uint)(bVar54 & 1) * auVar84._0_4_ |
                      (uint)!(bool)(bVar54 & 1) * auVar72._0_4_);
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      fVar124 = (float)((uint)bVar59 * auVar84._4_4_ | (uint)!bVar59 * auVar72._4_4_);
      bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
      fVar126 = (float)((uint)bVar59 * auVar84._8_4_ | (uint)!bVar59 * auVar72._8_4_);
      bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
      fVar128 = (float)((uint)bVar59 * auVar84._12_4_ | (uint)!bVar59 * auVar72._12_4_);
      auVar97 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar126,CONCAT44(fVar124,fVar64))));
      fVar65 = (float)((uint)(bVar54 & 1) * auVar81._0_4_ |
                      (uint)!(bool)(bVar54 & 1) * auVar73._0_4_);
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      fVar125 = (float)((uint)bVar59 * auVar81._4_4_ | (uint)!bVar59 * auVar73._4_4_);
      bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
      fVar127 = (float)((uint)bVar59 * auVar81._8_4_ | (uint)!bVar59 * auVar73._8_4_);
      bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
      fVar129 = (float)((uint)bVar59 * auVar81._12_4_ | (uint)!bVar59 * auVar73._12_4_);
      auVar96 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar127,CONCAT44(fVar125,fVar65))));
      auVar104._0_4_ =
           (float)((uint)(bVar54 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar78._0_4_);
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar59 * auVar98._4_4_ | (uint)!bVar59 * auVar78._4_4_);
      bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar59 * auVar98._8_4_ | (uint)!bVar59 * auVar78._8_4_);
      bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar59 * auVar98._12_4_ | (uint)!bVar59 * auVar78._12_4_);
      fVar174 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar98._16_4_);
      auVar104._16_4_ = fVar174;
      fVar171 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar98._20_4_);
      auVar104._20_4_ = fVar171;
      fVar175 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar98._24_4_);
      auVar104._24_4_ = fVar175;
      iVar1 = (uint)(byte)(uVar55 >> 7) * auVar98._28_4_;
      auVar104._28_4_ = iVar1;
      auVar99 = vblendmps_avx512vl(ZEXT1632(auVar76),auVar86);
      auVar105._0_4_ =
           (uint)(bVar54 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar81._0_4_;
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar105._4_4_ = (uint)bVar59 * auVar99._4_4_ | (uint)!bVar59 * auVar81._4_4_;
      bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar105._8_4_ = (uint)bVar59 * auVar99._8_4_ | (uint)!bVar59 * auVar81._8_4_;
      bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar105._12_4_ = (uint)bVar59 * auVar99._12_4_ | (uint)!bVar59 * auVar81._12_4_;
      auVar105._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * auVar99._16_4_;
      auVar105._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * auVar99._20_4_;
      auVar105._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * auVar99._24_4_;
      auVar105._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar99._28_4_;
      auVar99 = vblendmps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar80));
      auVar106._0_4_ =
           (float)((uint)(bVar54 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar75._0_4_);
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar59 * auVar99._4_4_ | (uint)!bVar59 * auVar75._4_4_);
      bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar59 * auVar99._8_4_ | (uint)!bVar59 * auVar75._8_4_);
      bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar59 * auVar99._12_4_ | (uint)!bVar59 * auVar75._12_4_);
      fVar166 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar99._16_4_);
      auVar106._16_4_ = fVar166;
      fVar169 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar99._20_4_);
      auVar106._20_4_ = fVar169;
      fVar167 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar99._24_4_);
      auVar106._24_4_ = fVar167;
      auVar106._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar99._28_4_;
      auVar99 = vblendmps_avx512vl(auVar101,ZEXT1632(auVar18));
      auVar107._0_4_ =
           (float)((uint)(bVar54 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar98._0_4_);
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar59 * auVar99._4_4_ | (uint)!bVar59 * auVar98._4_4_);
      bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar59 * auVar99._8_4_ | (uint)!bVar59 * auVar98._8_4_);
      bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar59 * auVar99._12_4_ | (uint)!bVar59 * auVar98._12_4_);
      bVar59 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar107._16_4_ = (float)((uint)bVar59 * auVar99._16_4_ | (uint)!bVar59 * auVar98._16_4_);
      bVar59 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar107._20_4_ = (float)((uint)bVar59 * auVar99._20_4_ | (uint)!bVar59 * auVar98._20_4_);
      bVar59 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar107._24_4_ = (float)((uint)bVar59 * auVar99._24_4_ | (uint)!bVar59 * auVar98._24_4_);
      bVar59 = SUB81(uVar55 >> 7,0);
      auVar107._28_4_ = (uint)bVar59 * auVar99._28_4_ | (uint)!bVar59 * auVar98._28_4_;
      auVar108._0_4_ =
           (uint)(bVar54 & 1) * (int)auVar76._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar86._0_4_;
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar108._4_4_ = (uint)bVar59 * (int)auVar76._4_4_ | (uint)!bVar59 * auVar86._4_4_;
      bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar108._8_4_ = (uint)bVar59 * (int)auVar76._8_4_ | (uint)!bVar59 * auVar86._8_4_;
      bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar108._12_4_ = (uint)bVar59 * (int)auVar76._12_4_ | (uint)!bVar59 * auVar86._12_4_;
      auVar108._16_4_ = (uint)!(bool)((byte)(uVar55 >> 4) & 1) * auVar86._16_4_;
      auVar108._20_4_ = (uint)!(bool)((byte)(uVar55 >> 5) & 1) * auVar86._20_4_;
      auVar108._24_4_ = (uint)!(bool)((byte)(uVar55 >> 6) & 1) * auVar86._24_4_;
      auVar108._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar86._28_4_;
      bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar109._0_4_ =
           (uint)(bVar54 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar18._0_4_;
      bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar109._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar18._4_4_;
      bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar109._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar18._8_4_;
      bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar109._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar18._12_4_;
      auVar109._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * auVar101._16_4_;
      auVar109._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * auVar101._20_4_;
      auVar109._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * auVar101._24_4_;
      iVar2 = (uint)(byte)(uVar55 >> 7) * auVar101._28_4_;
      auVar109._28_4_ = iVar2;
      auVar88 = vsubps_avx512vl(auVar108,auVar97);
      auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar77._12_4_ |
                                               (uint)!bVar15 * auVar80._12_4_,
                                               CONCAT48((uint)bVar13 * (int)auVar77._8_4_ |
                                                        (uint)!bVar13 * auVar80._8_4_,
                                                        CONCAT44((uint)bVar59 * (int)auVar77._4_4_ |
                                                                 (uint)!bVar59 * auVar80._4_4_,
                                                                 (uint)(bVar54 & 1) *
                                                                 (int)auVar77._0_4_ |
                                                                 (uint)!(bool)(bVar54 & 1) *
                                                                 auVar80._0_4_)))),auVar96);
      auVar99 = vsubps_avx(auVar109,auVar104);
      auVar98 = vsubps_avx(auVar97,auVar105);
      auVar86 = vsubps_avx(auVar96,auVar106);
      auVar87 = vsubps_avx(auVar104,auVar107);
      auVar89._4_4_ = auVar99._4_4_ * fVar124;
      auVar89._0_4_ = auVar99._0_4_ * fVar64;
      auVar89._8_4_ = auVar99._8_4_ * fVar126;
      auVar89._12_4_ = auVar99._12_4_ * fVar128;
      auVar89._16_4_ = auVar99._16_4_ * 0.0;
      auVar89._20_4_ = auVar99._20_4_ * 0.0;
      auVar89._24_4_ = auVar99._24_4_ * 0.0;
      auVar89._28_4_ = iVar2;
      auVar84 = vfmsub231ps_fma(auVar89,auVar104,auVar88);
      auVar90._4_4_ = fVar125 * auVar88._4_4_;
      auVar90._0_4_ = fVar65 * auVar88._0_4_;
      auVar90._8_4_ = fVar127 * auVar88._8_4_;
      auVar90._12_4_ = fVar129 * auVar88._12_4_;
      auVar90._16_4_ = auVar88._16_4_ * 0.0;
      auVar90._20_4_ = auVar88._20_4_ * 0.0;
      auVar90._24_4_ = auVar88._24_4_ * 0.0;
      auVar90._28_4_ = auVar100._28_4_;
      auVar81 = vfmsub231ps_fma(auVar90,auVar97,auVar101);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar92,ZEXT1632(auVar84));
      auVar156._0_4_ = auVar101._0_4_ * auVar104._0_4_;
      auVar156._4_4_ = auVar101._4_4_ * auVar104._4_4_;
      auVar156._8_4_ = auVar101._8_4_ * auVar104._8_4_;
      auVar156._12_4_ = auVar101._12_4_ * auVar104._12_4_;
      auVar156._16_4_ = auVar101._16_4_ * fVar174;
      auVar156._20_4_ = auVar101._20_4_ * fVar171;
      auVar156._24_4_ = auVar101._24_4_ * fVar175;
      auVar156._28_4_ = 0;
      auVar84 = vfmsub231ps_fma(auVar156,auVar96,auVar99);
      auVar89 = vfmadd231ps_avx512vl(auVar100,auVar92,ZEXT1632(auVar84));
      auVar100 = vmulps_avx512vl(auVar87,auVar105);
      auVar100 = vfmsub231ps_avx512vl(auVar100,auVar98,auVar107);
      auVar91._4_4_ = auVar86._4_4_ * auVar107._4_4_;
      auVar91._0_4_ = auVar86._0_4_ * auVar107._0_4_;
      auVar91._8_4_ = auVar86._8_4_ * auVar107._8_4_;
      auVar91._12_4_ = auVar86._12_4_ * auVar107._12_4_;
      auVar91._16_4_ = auVar86._16_4_ * auVar107._16_4_;
      auVar91._20_4_ = auVar86._20_4_ * auVar107._20_4_;
      auVar91._24_4_ = auVar86._24_4_ * auVar107._24_4_;
      auVar91._28_4_ = auVar107._28_4_;
      auVar84 = vfmsub231ps_fma(auVar91,auVar106,auVar87);
      auVar157._0_4_ = auVar106._0_4_ * auVar98._0_4_;
      auVar157._4_4_ = auVar106._4_4_ * auVar98._4_4_;
      auVar157._8_4_ = auVar106._8_4_ * auVar98._8_4_;
      auVar157._12_4_ = auVar106._12_4_ * auVar98._12_4_;
      auVar157._16_4_ = fVar166 * auVar98._16_4_;
      auVar157._20_4_ = fVar169 * auVar98._20_4_;
      auVar157._24_4_ = fVar167 * auVar98._24_4_;
      auVar157._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar157,auVar86,auVar105);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar92,auVar100);
      auVar90 = vfmadd231ps_avx512vl(auVar100,auVar92,ZEXT1632(auVar84));
      auVar100 = vmaxps_avx(auVar89,auVar90);
      uVar138 = vcmpps_avx512vl(auVar100,auVar92,2);
      bVar63 = bVar63 & (byte)uVar138;
      auVar193 = ZEXT3264(local_4e0);
      auVar194 = ZEXT3264(local_4c0);
      auVar190 = ZEXT3264(local_640);
      auVar189 = ZEXT3264(local_660);
      if (bVar63 == 0) {
        bVar59 = false;
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar191 = ZEXT3264(auVar100);
        auVar195 = ZEXT3264(local_5a0);
        auVar196 = ZEXT3264(local_5c0);
        auVar198 = ZEXT3264(local_5e0);
      }
      else {
        auVar30._4_4_ = auVar87._4_4_ * auVar101._4_4_;
        auVar30._0_4_ = auVar87._0_4_ * auVar101._0_4_;
        auVar30._8_4_ = auVar87._8_4_ * auVar101._8_4_;
        auVar30._12_4_ = auVar87._12_4_ * auVar101._12_4_;
        auVar30._16_4_ = auVar87._16_4_ * auVar101._16_4_;
        auVar30._20_4_ = auVar87._20_4_ * auVar101._20_4_;
        auVar30._24_4_ = auVar87._24_4_ * auVar101._24_4_;
        auVar30._28_4_ = auVar100._28_4_;
        auVar80 = vfmsub231ps_fma(auVar30,auVar86,auVar99);
        auVar31._4_4_ = auVar99._4_4_ * auVar98._4_4_;
        auVar31._0_4_ = auVar99._0_4_ * auVar98._0_4_;
        auVar31._8_4_ = auVar99._8_4_ * auVar98._8_4_;
        auVar31._12_4_ = auVar99._12_4_ * auVar98._12_4_;
        auVar31._16_4_ = auVar99._16_4_ * auVar98._16_4_;
        auVar31._20_4_ = auVar99._20_4_ * auVar98._20_4_;
        auVar31._24_4_ = auVar99._24_4_ * auVar98._24_4_;
        auVar31._28_4_ = auVar99._28_4_;
        auVar81 = vfmsub231ps_fma(auVar31,auVar88,auVar87);
        auVar32._4_4_ = auVar86._4_4_ * auVar88._4_4_;
        auVar32._0_4_ = auVar86._0_4_ * auVar88._0_4_;
        auVar32._8_4_ = auVar86._8_4_ * auVar88._8_4_;
        auVar32._12_4_ = auVar86._12_4_ * auVar88._12_4_;
        auVar32._16_4_ = auVar86._16_4_ * auVar88._16_4_;
        auVar32._20_4_ = auVar86._20_4_ * auVar88._20_4_;
        auVar32._24_4_ = auVar86._24_4_ * auVar88._24_4_;
        auVar32._28_4_ = auVar86._28_4_;
        auVar18 = vfmsub231ps_fma(auVar32,auVar98,auVar101);
        auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar18));
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar80),auVar92);
        auVar101 = vrcp14ps_avx512vl(auVar100);
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar191 = ZEXT3264(auVar99);
        auVar98 = vfnmadd213ps_avx512vl(auVar101,auVar100,auVar99);
        auVar84 = vfmadd132ps_fma(auVar98,auVar101,auVar101);
        auVar33._4_4_ = auVar18._4_4_ * auVar104._4_4_;
        auVar33._0_4_ = auVar18._0_4_ * auVar104._0_4_;
        auVar33._8_4_ = auVar18._8_4_ * auVar104._8_4_;
        auVar33._12_4_ = auVar18._12_4_ * auVar104._12_4_;
        auVar33._16_4_ = fVar174 * 0.0;
        auVar33._20_4_ = fVar171 * 0.0;
        auVar33._24_4_ = fVar175 * 0.0;
        auVar33._28_4_ = iVar1;
        auVar81 = vfmadd231ps_fma(auVar33,auVar96,ZEXT1632(auVar81));
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar97,ZEXT1632(auVar80));
        fVar171 = auVar84._0_4_;
        fVar174 = auVar84._4_4_;
        fVar175 = auVar84._8_4_;
        fVar167 = auVar84._12_4_;
        local_380 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar167,
                                       CONCAT48(auVar81._8_4_ * fVar175,
                                                CONCAT44(auVar81._4_4_ * fVar174,
                                                         auVar81._0_4_ * fVar171))));
        auVar170._4_4_ = uVar172;
        auVar170._0_4_ = uVar172;
        auVar170._8_4_ = uVar172;
        auVar170._12_4_ = uVar172;
        auVar170._16_4_ = uVar172;
        auVar170._20_4_ = uVar172;
        auVar170._24_4_ = uVar172;
        auVar170._28_4_ = uVar172;
        uVar138 = vcmpps_avx512vl(auVar170,local_380,2);
        uVar132 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar25._4_4_ = uVar132;
        auVar25._0_4_ = uVar132;
        auVar25._8_4_ = uVar132;
        auVar25._12_4_ = uVar132;
        auVar25._16_4_ = uVar132;
        auVar25._20_4_ = uVar132;
        auVar25._24_4_ = uVar132;
        auVar25._28_4_ = uVar132;
        uVar21 = vcmpps_avx512vl(local_380,auVar25,2);
        bVar63 = (byte)uVar138 & (byte)uVar21 & bVar63;
        auVar195 = ZEXT3264(local_5a0);
        auVar196 = ZEXT3264(local_5c0);
        auVar198 = ZEXT3264(local_5e0);
        if (bVar63 != 0) {
          uVar138 = vcmpps_avx512vl(auVar100,auVar92,4);
          bVar63 = bVar63 & (byte)uVar138;
          if (bVar63 != 0) {
            fVar166 = auVar89._0_4_ * fVar171;
            fVar169 = auVar89._4_4_ * fVar174;
            auVar34._4_4_ = fVar169;
            auVar34._0_4_ = fVar166;
            fVar64 = auVar89._8_4_ * fVar175;
            auVar34._8_4_ = fVar64;
            fVar65 = auVar89._12_4_ * fVar167;
            auVar34._12_4_ = fVar65;
            fVar124 = auVar89._16_4_ * 0.0;
            auVar34._16_4_ = fVar124;
            fVar125 = auVar89._20_4_ * 0.0;
            auVar34._20_4_ = fVar125;
            fVar126 = auVar89._24_4_ * 0.0;
            auVar34._24_4_ = fVar126;
            auVar34._28_4_ = auVar100._28_4_;
            auVar101 = vsubps_avx512vl(auVar99,auVar34);
            local_3c0._0_4_ =
                 (float)((uint)(bVar54 & 1) * (int)fVar166 |
                        (uint)!(bool)(bVar54 & 1) * auVar101._0_4_);
            bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
            local_3c0._4_4_ = (float)((uint)bVar59 * (int)fVar169 | (uint)!bVar59 * auVar101._4_4_);
            bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
            local_3c0._8_4_ = (float)((uint)bVar59 * (int)fVar64 | (uint)!bVar59 * auVar101._8_4_);
            bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
            local_3c0._12_4_ = (float)((uint)bVar59 * (int)fVar65 | (uint)!bVar59 * auVar101._12_4_)
            ;
            bVar59 = (bool)((byte)(uVar55 >> 4) & 1);
            local_3c0._16_4_ =
                 (float)((uint)bVar59 * (int)fVar124 | (uint)!bVar59 * auVar101._16_4_);
            bVar59 = (bool)((byte)(uVar55 >> 5) & 1);
            local_3c0._20_4_ =
                 (float)((uint)bVar59 * (int)fVar125 | (uint)!bVar59 * auVar101._20_4_);
            bVar59 = (bool)((byte)(uVar55 >> 6) & 1);
            local_3c0._24_4_ =
                 (float)((uint)bVar59 * (int)fVar126 | (uint)!bVar59 * auVar101._24_4_);
            bVar59 = SUB81(uVar55 >> 7,0);
            local_3c0._28_4_ =
                 (float)((uint)bVar59 * auVar100._28_4_ | (uint)!bVar59 * auVar101._28_4_);
            auVar100 = vsubps_avx(ZEXT1632(auVar74),auVar93);
            auVar84 = vfmadd213ps_fma(auVar100,local_3c0,auVar93);
            uVar132 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar93._4_4_ = uVar132;
            auVar93._0_4_ = uVar132;
            auVar93._8_4_ = uVar132;
            auVar93._12_4_ = uVar132;
            auVar93._16_4_ = uVar132;
            auVar93._20_4_ = uVar132;
            auVar93._24_4_ = uVar132;
            auVar93._28_4_ = uVar132;
            auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                                          CONCAT48(auVar84._8_4_ + auVar84._8_4_,
                                                                   CONCAT44(auVar84._4_4_ +
                                                                            auVar84._4_4_,
                                                                            auVar84._0_4_ +
                                                                            auVar84._0_4_)))),
                                       auVar93);
            uVar138 = vcmpps_avx512vl(local_380,auVar100,6);
            if (((byte)uVar138 & bVar63) != 0) {
              auVar150._0_4_ = auVar90._0_4_ * fVar171;
              auVar150._4_4_ = auVar90._4_4_ * fVar174;
              auVar150._8_4_ = auVar90._8_4_ * fVar175;
              auVar150._12_4_ = auVar90._12_4_ * fVar167;
              auVar150._16_4_ = auVar90._16_4_ * 0.0;
              auVar150._20_4_ = auVar90._20_4_ * 0.0;
              auVar150._24_4_ = auVar90._24_4_ * 0.0;
              auVar150._28_4_ = 0;
              auVar100 = vsubps_avx512vl(auVar99,auVar150);
              auVar110._0_4_ =
                   (uint)(bVar54 & 1) * (int)auVar150._0_4_ |
                   (uint)!(bool)(bVar54 & 1) * auVar100._0_4_;
              bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
              auVar110._4_4_ = (uint)bVar59 * (int)auVar150._4_4_ | (uint)!bVar59 * auVar100._4_4_;
              bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
              auVar110._8_4_ = (uint)bVar59 * (int)auVar150._8_4_ | (uint)!bVar59 * auVar100._8_4_;
              bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
              auVar110._12_4_ =
                   (uint)bVar59 * (int)auVar150._12_4_ | (uint)!bVar59 * auVar100._12_4_;
              bVar59 = (bool)((byte)(uVar55 >> 4) & 1);
              auVar110._16_4_ =
                   (uint)bVar59 * (int)auVar150._16_4_ | (uint)!bVar59 * auVar100._16_4_;
              bVar59 = (bool)((byte)(uVar55 >> 5) & 1);
              auVar110._20_4_ =
                   (uint)bVar59 * (int)auVar150._20_4_ | (uint)!bVar59 * auVar100._20_4_;
              bVar59 = (bool)((byte)(uVar55 >> 6) & 1);
              auVar110._24_4_ =
                   (uint)bVar59 * (int)auVar150._24_4_ | (uint)!bVar59 * auVar100._24_4_;
              auVar110._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar100._28_4_;
              auVar26._8_4_ = 0x40000000;
              auVar26._0_8_ = 0x4000000040000000;
              auVar26._12_4_ = 0x40000000;
              auVar26._16_4_ = 0x40000000;
              auVar26._20_4_ = 0x40000000;
              auVar26._24_4_ = 0x40000000;
              auVar26._28_4_ = 0x40000000;
              local_3a0 = vfmsub132ps_avx512vl(auVar110,auVar99,auVar26);
              local_360 = 0;
              local_350 = local_5f0._0_8_;
              uStack_348 = local_5f0._8_8_;
              local_340 = local_600._0_8_;
              uStack_338 = local_600._8_8_;
              local_330 = local_610._0_8_;
              uStack_328 = local_610._8_8_;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar59 = true, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_018eb7cc;
                fVar149 = 1.0 / fVar149;
                local_300[0] = fVar149 * (local_3c0._0_4_ + 0.0);
                local_300[1] = fVar149 * (local_3c0._4_4_ + 1.0);
                local_300[2] = fVar149 * (local_3c0._8_4_ + 2.0);
                local_300[3] = fVar149 * (local_3c0._12_4_ + 3.0);
                fStack_2f0 = fVar149 * (local_3c0._16_4_ + 4.0);
                fStack_2ec = fVar149 * (local_3c0._20_4_ + 5.0);
                fStack_2e8 = fVar149 * (local_3c0._24_4_ + 6.0);
                fStack_2e4 = local_3c0._28_4_ + 7.0;
                local_2e0 = local_3a0;
                local_2c0 = local_380;
                local_440 = 0;
                uVar60 = (ulong)((byte)uVar138 & bVar63);
                for (uVar55 = uVar60; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000)
                {
                  local_440 = local_440 + 1;
                }
                local_460 = vpbroadcastd_avx512vl();
                local_35c = iVar7;
                while( true ) {
                  auVar79 = auVar199._0_16_;
                  auVar84 = auVar192._0_16_;
                  if (uVar60 == 0) break;
                  uVar132 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar149 = local_300[local_440];
                  auVar142._4_4_ = fVar149;
                  auVar142._0_4_ = fVar149;
                  auVar142._8_4_ = fVar149;
                  auVar142._12_4_ = fVar149;
                  local_200._16_4_ = fVar149;
                  local_200._0_16_ = auVar142;
                  local_200._20_4_ = fVar149;
                  local_200._24_4_ = fVar149;
                  local_200._28_4_ = fVar149;
                  local_1e0 = *(undefined4 *)(local_2e0 + local_440 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + local_440 * 4);
                  local_690.context = context->user;
                  fVar171 = 1.0 - fVar149;
                  auVar22._8_4_ = 0x80000000;
                  auVar22._0_8_ = 0x8000000080000000;
                  auVar22._12_4_ = 0x80000000;
                  auVar80 = vxorps_avx512vl(ZEXT416((uint)fVar171),auVar22);
                  auVar79 = ZEXT416((uint)(fVar149 * fVar171 * 4.0));
                  auVar81 = vfnmsub213ss_fma(auVar142,auVar142,auVar79);
                  auVar79 = vfmadd213ss_fma(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),auVar79);
                  fVar171 = fVar171 * auVar80._0_4_ * 0.5;
                  fVar174 = auVar81._0_4_ * 0.5;
                  fVar175 = auVar79._0_4_ * 0.5;
                  fVar149 = fVar149 * fVar149 * 0.5;
                  auVar162._0_4_ = fVar149 * (float)local_470._0_4_;
                  auVar162._4_4_ = fVar149 * (float)local_470._4_4_;
                  auVar162._8_4_ = fVar149 * fStack_468;
                  auVar162._12_4_ = fVar149 * fStack_464;
                  auVar134._4_4_ = fVar175;
                  auVar134._0_4_ = fVar175;
                  auVar134._8_4_ = fVar175;
                  auVar134._12_4_ = fVar175;
                  auVar79 = vfmadd132ps_fma(auVar134,auVar162,local_610);
                  auVar154._4_4_ = fVar174;
                  auVar154._0_4_ = fVar174;
                  auVar154._8_4_ = fVar174;
                  auVar154._12_4_ = fVar174;
                  auVar79 = vfmadd132ps_fma(auVar154,auVar79,local_600);
                  auVar135._4_4_ = fVar171;
                  auVar135._0_4_ = fVar171;
                  auVar135._8_4_ = fVar171;
                  auVar135._12_4_ = fVar171;
                  auVar79 = vfmadd132ps_fma(auVar135,auVar79,local_5f0);
                  local_260 = auVar79._0_4_;
                  auVar158._8_4_ = 1;
                  auVar158._0_8_ = 0x100000001;
                  auVar158._12_4_ = 1;
                  auVar158._16_4_ = 1;
                  auVar158._20_4_ = 1;
                  auVar158._24_4_ = 1;
                  auVar158._28_4_ = 1;
                  local_240 = vpermps_avx2(auVar158,ZEXT1632(auVar79));
                  auVar164._8_4_ = 2;
                  auVar164._0_8_ = 0x200000002;
                  auVar164._12_4_ = 2;
                  auVar164._16_4_ = 2;
                  auVar164._20_4_ = 2;
                  auVar164._24_4_ = 2;
                  auVar164._28_4_ = 2;
                  local_220 = vpermps_avx2(auVar164,ZEXT1632(auVar79));
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_280._0_8_;
                  uStack_1b8 = local_280._8_8_;
                  uStack_1b0 = local_280._16_8_;
                  uStack_1a8 = local_280._24_8_;
                  local_1a0 = local_460;
                  vpcmpeqd_avx2(local_460,local_460);
                  local_180 = (local_690.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_690.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_560 = local_2a0;
                  local_690.valid = (int *)local_560;
                  local_690.geometryUserPtr = pGVar8->userPtr;
                  local_690.hit = (RTCHitN *)&local_260;
                  local_690.N = 8;
                  local_420 = (uint)uVar60;
                  uStack_41c = (uint)(uVar60 >> 0x20);
                  local_690.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_690);
                    uVar60 = CONCAT44(uStack_41c,local_420);
                    auVar199 = ZEXT1664(local_4a0._0_16_);
                    auVar198 = ZEXT3264(local_5e0);
                    auVar196 = ZEXT3264(local_5c0);
                    auVar197 = ZEXT3264(local_500);
                    auVar195 = ZEXT3264(local_5a0);
                    auVar189 = ZEXT3264(local_660);
                    auVar190 = ZEXT3264(local_640);
                    auVar194 = ZEXT3264(local_4c0);
                    auVar193 = ZEXT3264(local_4e0);
                    auVar79 = vxorps_avx512vl(auVar84,auVar84);
                    auVar192 = ZEXT1664(auVar79);
                    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar191 = ZEXT3264(auVar100);
                    uVar172 = local_520._0_4_;
                  }
                  auVar79 = auVar192._0_16_;
                  if (local_560 != (undefined1  [32])0x0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_690);
                      uVar60 = CONCAT44(uStack_41c,local_420);
                      auVar199 = ZEXT1664(local_4a0._0_16_);
                      auVar198 = ZEXT3264(local_5e0);
                      auVar196 = ZEXT3264(local_5c0);
                      auVar197 = ZEXT3264(local_500);
                      auVar195 = ZEXT3264(local_5a0);
                      auVar189 = ZEXT3264(local_660);
                      auVar190 = ZEXT3264(local_640);
                      auVar194 = ZEXT3264(local_4c0);
                      auVar193 = ZEXT3264(local_4e0);
                      auVar79 = vxorps_avx512vl(auVar79,auVar79);
                      auVar192 = ZEXT1664(auVar79);
                      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar191 = ZEXT3264(auVar100);
                      uVar172 = local_520._0_4_;
                    }
                    auVar79 = auVar199._0_16_;
                    uVar55 = vptestmd_avx512vl(local_560,local_560);
                    auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar59 = (bool)((byte)uVar55 & 1);
                    auVar111._0_4_ =
                         (uint)bVar59 * auVar100._0_4_ |
                         (uint)!bVar59 * *(int *)(local_690.ray + 0x100);
                    bVar59 = (bool)((byte)(uVar55 >> 1) & 1);
                    auVar111._4_4_ =
                         (uint)bVar59 * auVar100._4_4_ |
                         (uint)!bVar59 * *(int *)(local_690.ray + 0x104);
                    bVar59 = (bool)((byte)(uVar55 >> 2) & 1);
                    auVar111._8_4_ =
                         (uint)bVar59 * auVar100._8_4_ |
                         (uint)!bVar59 * *(int *)(local_690.ray + 0x108);
                    bVar59 = (bool)((byte)(uVar55 >> 3) & 1);
                    auVar111._12_4_ =
                         (uint)bVar59 * auVar100._12_4_ |
                         (uint)!bVar59 * *(int *)(local_690.ray + 0x10c);
                    bVar59 = (bool)((byte)(uVar55 >> 4) & 1);
                    auVar111._16_4_ =
                         (uint)bVar59 * auVar100._16_4_ |
                         (uint)!bVar59 * *(int *)(local_690.ray + 0x110);
                    bVar59 = (bool)((byte)(uVar55 >> 5) & 1);
                    auVar111._20_4_ =
                         (uint)bVar59 * auVar100._20_4_ |
                         (uint)!bVar59 * *(int *)(local_690.ray + 0x114);
                    bVar59 = (bool)((byte)(uVar55 >> 6) & 1);
                    auVar111._24_4_ =
                         (uint)bVar59 * auVar100._24_4_ |
                         (uint)!bVar59 * *(int *)(local_690.ray + 0x118);
                    bVar59 = SUB81(uVar55 >> 7,0);
                    auVar111._28_4_ =
                         (uint)bVar59 * auVar100._28_4_ |
                         (uint)!bVar59 * *(int *)(local_690.ray + 0x11c);
                    *(undefined1 (*) [32])(local_690.ray + 0x100) = auVar111;
                    if (local_560 != (undefined1  [32])0x0) {
                      bVar59 = true;
                      goto LAB_018eb7cc;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar132;
                  uVar55 = local_440 & 0x3f;
                  local_440 = 0;
                  uVar60 = uVar60 ^ 1L << uVar55;
                  for (uVar55 = uVar60; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000
                      ) {
                    local_440 = local_440 + 1;
                  }
                }
              }
            }
          }
        }
        bVar59 = false;
      }
    }
LAB_018eb7cc:
    if (8 < iVar7) {
      local_4a0 = vpbroadcastd_avx512vl();
      local_520 = vbroadcastss_avx512vl(auVar79);
      fStack_438 = 1.0 / (float)local_400._0_4_;
      local_400 = vpbroadcastd_avx512vl();
      fStack_434 = fStack_438;
      fStack_430 = fStack_438;
      fStack_42c = fStack_438;
      fStack_428 = fStack_438;
      fStack_424 = fStack_438;
      local_420 = uVar172;
      uStack_41c = uVar172;
      uStack_418 = uVar172;
      uStack_414 = uVar172;
      uStack_410 = uVar172;
      uStack_40c = uVar172;
      uStack_408 = uVar172;
      uStack_404 = uVar172;
      local_440._0_4_ = fStack_438;
      local_440._4_4_ = fStack_438;
      for (lVar57 = 8; lVar57 < iVar7; lVar57 = lVar57 + 8) {
        auVar100 = vpbroadcastd_avx512vl();
        auVar86 = vpor_avx2(auVar100,_DAT_01fb4ba0);
        uVar21 = vpcmpd_avx512vl(auVar86,local_4a0,1);
        auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar57 * 4 + lVar62);
        auVar101 = *(undefined1 (*) [32])(lVar62 + 0x21fffac + lVar57 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar62 + 0x2200430 + lVar57 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar62 + 0x22008b4 + lVar57 * 4);
        local_5c0 = auVar196._0_32_;
        auVar87 = vmulps_avx512vl(local_5c0,auVar98);
        local_5e0 = auVar198._0_32_;
        auVar97 = vmulps_avx512vl(local_5e0,auVar98);
        auVar35._4_4_ = auVar98._4_4_ * (float)local_e0._4_4_;
        auVar35._0_4_ = auVar98._0_4_ * (float)local_e0._0_4_;
        auVar35._8_4_ = auVar98._8_4_ * fStack_d8;
        auVar35._12_4_ = auVar98._12_4_ * fStack_d4;
        auVar35._16_4_ = auVar98._16_4_ * fStack_d0;
        auVar35._20_4_ = auVar98._20_4_ * fStack_cc;
        auVar35._24_4_ = auVar98._24_4_ * fStack_c8;
        auVar35._28_4_ = auVar86._28_4_;
        local_5a0 = auVar195._0_32_;
        auVar86 = vfmadd231ps_avx512vl(auVar87,auVar99,local_5a0);
        auVar105 = auVar197._0_32_;
        auVar87 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar105);
        auVar97 = vfmadd231ps_avx512vl(auVar35,auVar99,local_c0);
        auVar103 = auVar190._0_32_;
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar101,auVar103);
        auVar102 = auVar189._0_32_;
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar101,auVar102);
        auVar79 = vfmadd231ps_fma(auVar97,auVar101,local_a0);
        auVar104 = auVar193._0_32_;
        auVar90 = vfmadd231ps_avx512vl(auVar86,auVar100,auVar104);
        local_4c0 = auVar194._0_32_;
        auVar91 = vfmadd231ps_avx512vl(auVar87,auVar100,local_4c0);
        auVar86 = *(undefined1 (*) [32])(bspline_basis1 + lVar57 * 4 + lVar62);
        auVar87 = *(undefined1 (*) [32])(lVar62 + 0x22023cc + lVar57 * 4);
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar100,local_80);
        auVar97 = *(undefined1 (*) [32])(lVar62 + 0x2202850 + lVar57 * 4);
        auVar96 = *(undefined1 (*) [32])(lVar62 + 0x2202cd4 + lVar57 * 4);
        auVar88 = vmulps_avx512vl(local_5c0,auVar96);
        auVar89 = vmulps_avx512vl(local_5e0,auVar96);
        auVar36._4_4_ = auVar96._4_4_ * (float)local_e0._4_4_;
        auVar36._0_4_ = auVar96._0_4_ * (float)local_e0._0_4_;
        auVar36._8_4_ = auVar96._8_4_ * fStack_d8;
        auVar36._12_4_ = auVar96._12_4_ * fStack_d4;
        auVar36._16_4_ = auVar96._16_4_ * fStack_d0;
        auVar36._20_4_ = auVar96._20_4_ * fStack_cc;
        auVar36._24_4_ = auVar96._24_4_ * fStack_c8;
        auVar36._28_4_ = uStack_c4;
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar97,local_5a0);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar97,auVar105);
        auVar92 = vfmadd231ps_avx512vl(auVar36,auVar97,local_c0);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar103);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar102);
        auVar84 = vfmadd231ps_fma(auVar92,auVar87,local_a0);
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar104);
        auVar93 = vfmadd231ps_avx512vl(auVar89,auVar86,local_4c0);
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar86,local_80);
        auVar94 = vmaxps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar84));
        auVar88 = vsubps_avx(auVar92,auVar90);
        auVar89 = vsubps_avx(auVar93,auVar91);
        auVar95 = vmulps_avx512vl(auVar91,auVar88);
        auVar112 = vmulps_avx512vl(auVar90,auVar89);
        auVar95 = vsubps_avx512vl(auVar95,auVar112);
        auVar112 = vmulps_avx512vl(auVar89,auVar89);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar88,auVar88);
        auVar94 = vmulps_avx512vl(auVar94,auVar94);
        auVar94 = vmulps_avx512vl(auVar94,auVar112);
        auVar95 = vmulps_avx512vl(auVar95,auVar95);
        uVar138 = vcmpps_avx512vl(auVar95,auVar94,2);
        bVar63 = (byte)uVar21 & (byte)uVar138;
        if (bVar63 == 0) {
          auVar190 = ZEXT3264(auVar103);
          auVar189 = ZEXT3264(auVar102);
        }
        else {
          auVar96 = vmulps_avx512vl(local_580,auVar96);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_140,auVar96);
          auVar87 = vfmadd213ps_avx512vl(auVar87,local_120,auVar97);
          auVar86 = vfmadd213ps_avx512vl(auVar86,local_100,auVar87);
          auVar98 = vmulps_avx512vl(local_580,auVar98);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_140,auVar98);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_120,auVar99);
          auVar87 = vfmadd213ps_avx512vl(auVar100,local_100,auVar101);
          auVar100 = *(undefined1 (*) [32])(lVar62 + 0x2200d38 + lVar57 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar62 + 0x22011bc + lVar57 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar62 + 0x2201640 + lVar57 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar62 + 0x2201ac4 + lVar57 * 4);
          auVar97 = vmulps_avx512vl(local_5c0,auVar98);
          auVar96 = vmulps_avx512vl(local_5e0,auVar98);
          auVar98 = vmulps_avx512vl(local_580,auVar98);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,local_5a0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar105);
          auVar99 = vfmadd231ps_avx512vl(auVar98,local_140,auVar99);
          auVar98 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar103);
          auVar97 = vfmadd231ps_avx512vl(auVar96,auVar101,auVar102);
          auVar101 = vfmadd231ps_avx512vl(auVar99,local_120,auVar101);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar100,auVar104);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,local_4c0);
          auVar96 = vfmadd231ps_avx512vl(auVar101,local_100,auVar100);
          auVar100 = *(undefined1 (*) [32])(lVar62 + 0x2203158 + lVar57 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar62 + 0x2203a60 + lVar57 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar62 + 0x2203ee4 + lVar57 * 4);
          auVar94 = vmulps_avx512vl(local_5c0,auVar99);
          auVar95 = vmulps_avx512vl(local_5e0,auVar99);
          auVar99 = vmulps_avx512vl(local_580,auVar99);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_5a0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,auVar105);
          auVar99 = vfmadd231ps_avx512vl(auVar99,local_140,auVar101);
          auVar101 = *(undefined1 (*) [32])(lVar62 + 0x22035dc + lVar57 * 4);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,auVar103);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,auVar102);
          auVar101 = vfmadd231ps_avx512vl(auVar99,local_120,auVar101);
          auVar99 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar104);
          auVar94 = vfmadd231ps_avx512vl(auVar95,auVar100,local_4c0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,local_100,auVar100);
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar98,auVar95);
          vandps_avx512vl(auVar97,auVar95);
          auVar100 = vmaxps_avx(auVar95,auVar95);
          vandps_avx512vl(auVar96,auVar95);
          auVar100 = vmaxps_avx(auVar100,auVar95);
          uVar55 = vcmpps_avx512vl(auVar100,local_520,1);
          bVar12 = (bool)((byte)uVar55 & 1);
          auVar113._0_4_ = (float)((uint)bVar12 * auVar88._0_4_ | (uint)!bVar12 * auVar98._0_4_);
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar113._4_4_ = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar98._4_4_);
          bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar113._8_4_ = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar98._8_4_);
          bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar113._12_4_ = (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar98._12_4_);
          bVar12 = (bool)((byte)(uVar55 >> 4) & 1);
          auVar113._16_4_ = (float)((uint)bVar12 * auVar88._16_4_ | (uint)!bVar12 * auVar98._16_4_);
          bVar12 = (bool)((byte)(uVar55 >> 5) & 1);
          auVar113._20_4_ = (float)((uint)bVar12 * auVar88._20_4_ | (uint)!bVar12 * auVar98._20_4_);
          bVar12 = (bool)((byte)(uVar55 >> 6) & 1);
          auVar113._24_4_ = (float)((uint)bVar12 * auVar88._24_4_ | (uint)!bVar12 * auVar98._24_4_);
          bVar12 = SUB81(uVar55 >> 7,0);
          auVar113._28_4_ = (uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar98._28_4_;
          bVar12 = (bool)((byte)uVar55 & 1);
          auVar114._0_4_ = (float)((uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar97._0_4_);
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar97._4_4_);
          bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar97._8_4_);
          bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar97._12_4_);
          bVar12 = (bool)((byte)(uVar55 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar97._16_4_);
          bVar12 = (bool)((byte)(uVar55 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar97._20_4_);
          bVar12 = (bool)((byte)(uVar55 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar97._24_4_);
          bVar12 = SUB81(uVar55 >> 7,0);
          auVar114._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar97._28_4_;
          vandps_avx512vl(auVar99,auVar95);
          vandps_avx512vl(auVar94,auVar95);
          auVar100 = vmaxps_avx(auVar114,auVar114);
          vandps_avx512vl(auVar101,auVar95);
          auVar100 = vmaxps_avx(auVar100,auVar114);
          uVar55 = vcmpps_avx512vl(auVar100,local_520,1);
          bVar12 = (bool)((byte)uVar55 & 1);
          auVar115._0_4_ = (uint)bVar12 * auVar88._0_4_ | (uint)!bVar12 * auVar99._0_4_;
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar115._4_4_ = (uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar99._4_4_;
          bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar115._8_4_ = (uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar99._8_4_;
          bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar115._12_4_ = (uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar99._12_4_;
          bVar12 = (bool)((byte)(uVar55 >> 4) & 1);
          auVar115._16_4_ = (uint)bVar12 * auVar88._16_4_ | (uint)!bVar12 * auVar99._16_4_;
          bVar12 = (bool)((byte)(uVar55 >> 5) & 1);
          auVar115._20_4_ = (uint)bVar12 * auVar88._20_4_ | (uint)!bVar12 * auVar99._20_4_;
          bVar12 = (bool)((byte)(uVar55 >> 6) & 1);
          auVar115._24_4_ = (uint)bVar12 * auVar88._24_4_ | (uint)!bVar12 * auVar99._24_4_;
          bVar12 = SUB81(uVar55 >> 7,0);
          auVar115._28_4_ = (uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar99._28_4_;
          bVar12 = (bool)((byte)uVar55 & 1);
          auVar116._0_4_ = (float)((uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar94._0_4_);
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar94._4_4_);
          bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar94._8_4_);
          bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar94._12_4_);
          bVar12 = (bool)((byte)(uVar55 >> 4) & 1);
          auVar116._16_4_ = (float)((uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar94._16_4_);
          bVar12 = (bool)((byte)(uVar55 >> 5) & 1);
          auVar116._20_4_ = (float)((uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar94._20_4_);
          bVar12 = (bool)((byte)(uVar55 >> 6) & 1);
          auVar116._24_4_ = (float)((uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar94._24_4_);
          bVar12 = SUB81(uVar55 >> 7,0);
          auVar116._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar94._28_4_;
          auVar177._8_4_ = 0x80000000;
          auVar177._0_8_ = 0x8000000080000000;
          auVar177._12_4_ = 0x80000000;
          auVar177._16_4_ = 0x80000000;
          auVar177._20_4_ = 0x80000000;
          auVar177._24_4_ = 0x80000000;
          auVar177._28_4_ = 0x80000000;
          auVar100 = vxorps_avx512vl(auVar115,auVar177);
          auVar94 = auVar192._0_32_;
          auVar101 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar94);
          auVar81 = vfmadd231ps_fma(auVar101,auVar114,auVar114);
          auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
          auVar188._8_4_ = 0xbf000000;
          auVar188._0_8_ = 0xbf000000bf000000;
          auVar188._12_4_ = 0xbf000000;
          auVar188._16_4_ = 0xbf000000;
          auVar188._20_4_ = 0xbf000000;
          auVar188._24_4_ = 0xbf000000;
          auVar188._28_4_ = 0xbf000000;
          fVar149 = auVar101._0_4_;
          fVar171 = auVar101._4_4_;
          fVar174 = auVar101._8_4_;
          fVar175 = auVar101._12_4_;
          fVar167 = auVar101._16_4_;
          fVar166 = auVar101._20_4_;
          fVar169 = auVar101._24_4_;
          auVar37._4_4_ = fVar171 * fVar171 * fVar171 * auVar81._4_4_ * -0.5;
          auVar37._0_4_ = fVar149 * fVar149 * fVar149 * auVar81._0_4_ * -0.5;
          auVar37._8_4_ = fVar174 * fVar174 * fVar174 * auVar81._8_4_ * -0.5;
          auVar37._12_4_ = fVar175 * fVar175 * fVar175 * auVar81._12_4_ * -0.5;
          auVar37._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
          auVar37._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
          auVar37._24_4_ = fVar169 * fVar169 * fVar169 * -0.0;
          auVar37._28_4_ = auVar114._28_4_;
          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar101 = vfmadd231ps_avx512vl(auVar37,auVar99,auVar101);
          auVar38._4_4_ = auVar114._4_4_ * auVar101._4_4_;
          auVar38._0_4_ = auVar114._0_4_ * auVar101._0_4_;
          auVar38._8_4_ = auVar114._8_4_ * auVar101._8_4_;
          auVar38._12_4_ = auVar114._12_4_ * auVar101._12_4_;
          auVar38._16_4_ = auVar114._16_4_ * auVar101._16_4_;
          auVar38._20_4_ = auVar114._20_4_ * auVar101._20_4_;
          auVar38._24_4_ = auVar114._24_4_ * auVar101._24_4_;
          auVar38._28_4_ = 0;
          auVar39._4_4_ = auVar101._4_4_ * -auVar113._4_4_;
          auVar39._0_4_ = auVar101._0_4_ * -auVar113._0_4_;
          auVar39._8_4_ = auVar101._8_4_ * -auVar113._8_4_;
          auVar39._12_4_ = auVar101._12_4_ * -auVar113._12_4_;
          auVar39._16_4_ = auVar101._16_4_ * -auVar113._16_4_;
          auVar39._20_4_ = auVar101._20_4_ * -auVar113._20_4_;
          auVar39._24_4_ = auVar101._24_4_ * -auVar113._24_4_;
          auVar39._28_4_ = auVar114._28_4_;
          auVar98 = vmulps_avx512vl(auVar101,auVar94);
          auVar101 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar94);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar116,auVar116);
          auVar97 = vrsqrt14ps_avx512vl(auVar101);
          auVar101 = vmulps_avx512vl(auVar101,auVar188);
          fVar149 = auVar97._0_4_;
          fVar171 = auVar97._4_4_;
          fVar174 = auVar97._8_4_;
          fVar175 = auVar97._12_4_;
          fVar167 = auVar97._16_4_;
          fVar166 = auVar97._20_4_;
          fVar169 = auVar97._24_4_;
          auVar40._4_4_ = fVar171 * fVar171 * fVar171 * auVar101._4_4_;
          auVar40._0_4_ = fVar149 * fVar149 * fVar149 * auVar101._0_4_;
          auVar40._8_4_ = fVar174 * fVar174 * fVar174 * auVar101._8_4_;
          auVar40._12_4_ = fVar175 * fVar175 * fVar175 * auVar101._12_4_;
          auVar40._16_4_ = fVar167 * fVar167 * fVar167 * auVar101._16_4_;
          auVar40._20_4_ = fVar166 * fVar166 * fVar166 * auVar101._20_4_;
          auVar40._24_4_ = fVar169 * fVar169 * fVar169 * auVar101._24_4_;
          auVar40._28_4_ = auVar101._28_4_;
          auVar101 = vfmadd231ps_avx512vl(auVar40,auVar99,auVar97);
          auVar41._4_4_ = auVar116._4_4_ * auVar101._4_4_;
          auVar41._0_4_ = auVar116._0_4_ * auVar101._0_4_;
          auVar41._8_4_ = auVar116._8_4_ * auVar101._8_4_;
          auVar41._12_4_ = auVar116._12_4_ * auVar101._12_4_;
          auVar41._16_4_ = auVar116._16_4_ * auVar101._16_4_;
          auVar41._20_4_ = auVar116._20_4_ * auVar101._20_4_;
          auVar41._24_4_ = auVar116._24_4_ * auVar101._24_4_;
          auVar41._28_4_ = auVar97._28_4_;
          auVar42._4_4_ = auVar101._4_4_ * auVar100._4_4_;
          auVar42._0_4_ = auVar101._0_4_ * auVar100._0_4_;
          auVar42._8_4_ = auVar101._8_4_ * auVar100._8_4_;
          auVar42._12_4_ = auVar101._12_4_ * auVar100._12_4_;
          auVar42._16_4_ = auVar101._16_4_ * auVar100._16_4_;
          auVar42._20_4_ = auVar101._20_4_ * auVar100._20_4_;
          auVar42._24_4_ = auVar101._24_4_ * auVar100._24_4_;
          auVar42._28_4_ = auVar100._28_4_;
          auVar100 = vmulps_avx512vl(auVar101,auVar94);
          auVar81 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar79),auVar90);
          auVar101 = ZEXT1632(auVar79);
          auVar80 = vfmadd213ps_fma(auVar39,auVar101,auVar91);
          auVar99 = vfmadd213ps_avx512vl(auVar98,auVar101,auVar87);
          auVar97 = vfmadd213ps_avx512vl(auVar41,ZEXT1632(auVar84),auVar92);
          auVar73 = vfnmadd213ps_fma(auVar38,auVar101,auVar90);
          auVar96 = ZEXT1632(auVar84);
          auVar18 = vfmadd213ps_fma(auVar42,auVar96,auVar93);
          auVar74 = vfnmadd213ps_fma(auVar39,auVar101,auVar91);
          auVar75 = vfmadd213ps_fma(auVar100,auVar96,auVar86);
          auVar91 = ZEXT1632(auVar79);
          auVar78 = vfnmadd231ps_fma(auVar87,auVar91,auVar98);
          auVar76 = vfnmadd213ps_fma(auVar41,auVar96,auVar92);
          auVar77 = vfnmadd213ps_fma(auVar42,auVar96,auVar93);
          auVar85 = vfnmadd231ps_fma(auVar86,ZEXT1632(auVar84),auVar100);
          auVar86 = vsubps_avx512vl(auVar97,ZEXT1632(auVar73));
          auVar100 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar74));
          auVar101 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar78));
          auVar43._4_4_ = auVar100._4_4_ * auVar78._4_4_;
          auVar43._0_4_ = auVar100._0_4_ * auVar78._0_4_;
          auVar43._8_4_ = auVar100._8_4_ * auVar78._8_4_;
          auVar43._12_4_ = auVar100._12_4_ * auVar78._12_4_;
          auVar43._16_4_ = auVar100._16_4_ * 0.0;
          auVar43._20_4_ = auVar100._20_4_ * 0.0;
          auVar43._24_4_ = auVar100._24_4_ * 0.0;
          auVar43._28_4_ = auVar98._28_4_;
          auVar79 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar74),auVar101);
          auVar44._4_4_ = auVar101._4_4_ * auVar73._4_4_;
          auVar44._0_4_ = auVar101._0_4_ * auVar73._0_4_;
          auVar44._8_4_ = auVar101._8_4_ * auVar73._8_4_;
          auVar44._12_4_ = auVar101._12_4_ * auVar73._12_4_;
          auVar44._16_4_ = auVar101._16_4_ * 0.0;
          auVar44._20_4_ = auVar101._20_4_ * 0.0;
          auVar44._24_4_ = auVar101._24_4_ * 0.0;
          auVar44._28_4_ = auVar101._28_4_;
          auVar71 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar78),auVar86);
          auVar45._4_4_ = auVar74._4_4_ * auVar86._4_4_;
          auVar45._0_4_ = auVar74._0_4_ * auVar86._0_4_;
          auVar45._8_4_ = auVar74._8_4_ * auVar86._8_4_;
          auVar45._12_4_ = auVar74._12_4_ * auVar86._12_4_;
          auVar45._16_4_ = auVar86._16_4_ * 0.0;
          auVar45._20_4_ = auVar86._20_4_ * 0.0;
          auVar45._24_4_ = auVar86._24_4_ * 0.0;
          auVar45._28_4_ = auVar86._28_4_;
          auVar72 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar73),auVar100);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar72),auVar94,ZEXT1632(auVar71));
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar94,ZEXT1632(auVar79));
          uVar55 = vcmpps_avx512vl(auVar100,auVar94,2);
          bVar54 = (byte)uVar55;
          fVar124 = (float)((uint)(bVar54 & 1) * auVar81._0_4_ |
                           (uint)!(bool)(bVar54 & 1) * auVar76._0_4_);
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          fVar126 = (float)((uint)bVar12 * auVar81._4_4_ | (uint)!bVar12 * auVar76._4_4_);
          bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
          fVar128 = (float)((uint)bVar12 * auVar81._8_4_ | (uint)!bVar12 * auVar76._8_4_);
          bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
          fVar130 = (float)((uint)bVar12 * auVar81._12_4_ | (uint)!bVar12 * auVar76._12_4_);
          auVar96 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar124))));
          fVar125 = (float)((uint)(bVar54 & 1) * auVar80._0_4_ |
                           (uint)!(bool)(bVar54 & 1) * auVar77._0_4_);
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          fVar127 = (float)((uint)bVar12 * auVar80._4_4_ | (uint)!bVar12 * auVar77._4_4_);
          bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
          fVar129 = (float)((uint)bVar12 * auVar80._8_4_ | (uint)!bVar12 * auVar77._8_4_);
          bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
          fVar131 = (float)((uint)bVar12 * auVar80._12_4_ | (uint)!bVar12 * auVar77._12_4_);
          auVar88 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar125))));
          auVar117._0_4_ =
               (float)((uint)(bVar54 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar54 & 1) * auVar85._0_4_);
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar85._4_4_);
          bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar85._8_4_);
          bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar85._12_4_);
          fVar174 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar99._16_4_);
          auVar117._16_4_ = fVar174;
          fVar171 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar99._20_4_);
          auVar117._20_4_ = fVar171;
          fVar149 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar99._24_4_);
          auVar117._24_4_ = fVar149;
          iVar1 = (uint)(byte)(uVar55 >> 7) * auVar99._28_4_;
          auVar117._28_4_ = iVar1;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar73),auVar97);
          auVar118._0_4_ =
               (uint)(bVar54 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar79._0_4_;
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar118._4_4_ = (uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar79._4_4_;
          bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar118._8_4_ = (uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar79._8_4_;
          bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar118._12_4_ = (uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar79._12_4_;
          auVar118._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * auVar100._16_4_;
          auVar118._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * auVar100._20_4_;
          auVar118._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * auVar100._24_4_;
          auVar118._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar18));
          auVar119._0_4_ =
               (float)((uint)(bVar54 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar54 & 1) * auVar81._0_4_);
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar81._4_4_);
          bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar81._8_4_);
          bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar81._12_4_)
          ;
          fVar166 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar100._16_4_);
          auVar119._16_4_ = fVar166;
          fVar175 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar100._20_4_);
          auVar119._20_4_ = fVar175;
          fVar167 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar100._24_4_);
          auVar119._24_4_ = fVar167;
          auVar119._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar75));
          auVar120._0_4_ =
               (float)((uint)(bVar54 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar54 & 1) * auVar80._0_4_);
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar80._4_4_);
          bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar80._8_4_);
          bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar80._12_4_)
          ;
          fVar169 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar100._16_4_);
          auVar120._16_4_ = fVar169;
          fVar65 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar100._20_4_);
          auVar120._20_4_ = fVar65;
          fVar64 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar100._24_4_);
          auVar120._24_4_ = fVar64;
          iVar2 = (uint)(byte)(uVar55 >> 7) * auVar100._28_4_;
          auVar120._28_4_ = iVar2;
          auVar121._0_4_ =
               (uint)(bVar54 & 1) * (int)auVar73._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar97._0_4_;
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar12 * (int)auVar73._4_4_ | (uint)!bVar12 * auVar97._4_4_;
          bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar12 * (int)auVar73._8_4_ | (uint)!bVar12 * auVar97._8_4_;
          bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar12 * (int)auVar73._12_4_ | (uint)!bVar12 * auVar97._12_4_;
          auVar121._16_4_ = (uint)!(bool)((byte)(uVar55 >> 4) & 1) * auVar97._16_4_;
          auVar121._20_4_ = (uint)!(bool)((byte)(uVar55 >> 5) & 1) * auVar97._20_4_;
          auVar121._24_4_ = (uint)!(bool)((byte)(uVar55 >> 6) & 1) * auVar97._24_4_;
          auVar121._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar97._28_4_;
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar55 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar55 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar55 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar55 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar97 = vsubps_avx512vl(auVar121,auVar96);
          auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar74._12_4_ |
                                                   (uint)!bVar16 * auVar18._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar74._8_4_ |
                                                            (uint)!bVar15 * auVar18._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar74._4_4_ |
                                                                     (uint)!bVar12 * auVar18._4_4_,
                                                                     (uint)(bVar54 & 1) *
                                                                     (int)auVar74._0_4_ |
                                                                     (uint)!(bool)(bVar54 & 1) *
                                                                     auVar18._0_4_)))),auVar88);
          auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar78._12_4_ |
                                                  (uint)!bVar17 * auVar75._12_4_,
                                                  CONCAT48((uint)bVar14 * (int)auVar78._8_4_ |
                                                           (uint)!bVar14 * auVar75._8_4_,
                                                           CONCAT44((uint)bVar13 *
                                                                    (int)auVar78._4_4_ |
                                                                    (uint)!bVar13 * auVar75._4_4_,
                                                                    (uint)(bVar54 & 1) *
                                                                    (int)auVar78._0_4_ |
                                                                    (uint)!(bool)(bVar54 & 1) *
                                                                    auVar75._0_4_)))),auVar117);
          auVar98 = vsubps_avx(auVar96,auVar118);
          auVar86 = vsubps_avx(auVar88,auVar119);
          auVar87 = vsubps_avx(auVar117,auVar120);
          auVar46._4_4_ = auVar99._4_4_ * fVar126;
          auVar46._0_4_ = auVar99._0_4_ * fVar124;
          auVar46._8_4_ = auVar99._8_4_ * fVar128;
          auVar46._12_4_ = auVar99._12_4_ * fVar130;
          auVar46._16_4_ = auVar99._16_4_ * 0.0;
          auVar46._20_4_ = auVar99._20_4_ * 0.0;
          auVar46._24_4_ = auVar99._24_4_ * 0.0;
          auVar46._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar46,auVar117,auVar97);
          auVar151._0_4_ = fVar125 * auVar97._0_4_;
          auVar151._4_4_ = fVar127 * auVar97._4_4_;
          auVar151._8_4_ = fVar129 * auVar97._8_4_;
          auVar151._12_4_ = fVar131 * auVar97._12_4_;
          auVar151._16_4_ = auVar97._16_4_ * 0.0;
          auVar151._20_4_ = auVar97._20_4_ * 0.0;
          auVar151._24_4_ = auVar97._24_4_ * 0.0;
          auVar151._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar151,auVar96,auVar101);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar94,ZEXT1632(auVar79));
          auVar159._0_4_ = auVar101._0_4_ * auVar117._0_4_;
          auVar159._4_4_ = auVar101._4_4_ * auVar117._4_4_;
          auVar159._8_4_ = auVar101._8_4_ * auVar117._8_4_;
          auVar159._12_4_ = auVar101._12_4_ * auVar117._12_4_;
          auVar159._16_4_ = auVar101._16_4_ * fVar174;
          auVar159._20_4_ = auVar101._20_4_ * fVar171;
          auVar159._24_4_ = auVar101._24_4_ * fVar149;
          auVar159._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar159,auVar88,auVar99);
          auVar89 = vfmadd231ps_avx512vl(auVar100,auVar94,ZEXT1632(auVar79));
          auVar100 = vmulps_avx512vl(auVar87,auVar118);
          auVar100 = vfmsub231ps_avx512vl(auVar100,auVar98,auVar120);
          auVar47._4_4_ = auVar86._4_4_ * auVar120._4_4_;
          auVar47._0_4_ = auVar86._0_4_ * auVar120._0_4_;
          auVar47._8_4_ = auVar86._8_4_ * auVar120._8_4_;
          auVar47._12_4_ = auVar86._12_4_ * auVar120._12_4_;
          auVar47._16_4_ = auVar86._16_4_ * fVar169;
          auVar47._20_4_ = auVar86._20_4_ * fVar65;
          auVar47._24_4_ = auVar86._24_4_ * fVar64;
          auVar47._28_4_ = iVar2;
          auVar79 = vfmsub231ps_fma(auVar47,auVar119,auVar87);
          auVar160._0_4_ = auVar119._0_4_ * auVar98._0_4_;
          auVar160._4_4_ = auVar119._4_4_ * auVar98._4_4_;
          auVar160._8_4_ = auVar119._8_4_ * auVar98._8_4_;
          auVar160._12_4_ = auVar119._12_4_ * auVar98._12_4_;
          auVar160._16_4_ = fVar166 * auVar98._16_4_;
          auVar160._20_4_ = fVar175 * auVar98._20_4_;
          auVar160._24_4_ = fVar167 * auVar98._24_4_;
          auVar160._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar160,auVar86,auVar118);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar94,auVar100);
          auVar90 = vfmadd231ps_avx512vl(auVar100,auVar94,ZEXT1632(auVar79));
          auVar100 = vmaxps_avx(auVar89,auVar90);
          uVar138 = vcmpps_avx512vl(auVar100,auVar94,2);
          bVar63 = bVar63 & (byte)uVar138;
          if (bVar63 != 0) {
            auVar48._4_4_ = auVar87._4_4_ * auVar101._4_4_;
            auVar48._0_4_ = auVar87._0_4_ * auVar101._0_4_;
            auVar48._8_4_ = auVar87._8_4_ * auVar101._8_4_;
            auVar48._12_4_ = auVar87._12_4_ * auVar101._12_4_;
            auVar48._16_4_ = auVar87._16_4_ * auVar101._16_4_;
            auVar48._20_4_ = auVar87._20_4_ * auVar101._20_4_;
            auVar48._24_4_ = auVar87._24_4_ * auVar101._24_4_;
            auVar48._28_4_ = auVar100._28_4_;
            auVar80 = vfmsub231ps_fma(auVar48,auVar86,auVar99);
            auVar49._4_4_ = auVar99._4_4_ * auVar98._4_4_;
            auVar49._0_4_ = auVar99._0_4_ * auVar98._0_4_;
            auVar49._8_4_ = auVar99._8_4_ * auVar98._8_4_;
            auVar49._12_4_ = auVar99._12_4_ * auVar98._12_4_;
            auVar49._16_4_ = auVar99._16_4_ * auVar98._16_4_;
            auVar49._20_4_ = auVar99._20_4_ * auVar98._20_4_;
            auVar49._24_4_ = auVar99._24_4_ * auVar98._24_4_;
            auVar49._28_4_ = auVar99._28_4_;
            auVar81 = vfmsub231ps_fma(auVar49,auVar97,auVar87);
            auVar50._4_4_ = auVar86._4_4_ * auVar97._4_4_;
            auVar50._0_4_ = auVar86._0_4_ * auVar97._0_4_;
            auVar50._8_4_ = auVar86._8_4_ * auVar97._8_4_;
            auVar50._12_4_ = auVar86._12_4_ * auVar97._12_4_;
            auVar50._16_4_ = auVar86._16_4_ * auVar97._16_4_;
            auVar50._20_4_ = auVar86._20_4_ * auVar97._20_4_;
            auVar50._24_4_ = auVar86._24_4_ * auVar97._24_4_;
            auVar50._28_4_ = auVar86._28_4_;
            auVar18 = vfmsub231ps_fma(auVar50,auVar98,auVar101);
            auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar18));
            auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar80),auVar94);
            auVar101 = vrcp14ps_avx512vl(auVar100);
            auVar98 = auVar191._0_32_;
            auVar99 = vfnmadd213ps_avx512vl(auVar101,auVar100,auVar98);
            auVar79 = vfmadd132ps_fma(auVar99,auVar101,auVar101);
            auVar51._4_4_ = auVar18._4_4_ * auVar117._4_4_;
            auVar51._0_4_ = auVar18._0_4_ * auVar117._0_4_;
            auVar51._8_4_ = auVar18._8_4_ * auVar117._8_4_;
            auVar51._12_4_ = auVar18._12_4_ * auVar117._12_4_;
            auVar51._16_4_ = fVar174 * 0.0;
            auVar51._20_4_ = fVar171 * 0.0;
            auVar51._24_4_ = fVar149 * 0.0;
            auVar51._28_4_ = iVar1;
            auVar81 = vfmadd231ps_fma(auVar51,auVar88,ZEXT1632(auVar81));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar96,ZEXT1632(auVar80));
            fVar149 = auVar79._0_4_;
            fVar171 = auVar79._4_4_;
            fVar174 = auVar79._8_4_;
            fVar175 = auVar79._12_4_;
            local_380 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar175,
                                           CONCAT48(auVar81._8_4_ * fVar174,
                                                    CONCAT44(auVar81._4_4_ * fVar171,
                                                             auVar81._0_4_ * fVar149))));
            auVar53._4_4_ = uStack_41c;
            auVar53._0_4_ = local_420;
            auVar53._8_4_ = uStack_418;
            auVar53._12_4_ = uStack_414;
            auVar53._16_4_ = uStack_410;
            auVar53._20_4_ = uStack_40c;
            auVar53._24_4_ = uStack_408;
            auVar53._28_4_ = uStack_404;
            uVar138 = vcmpps_avx512vl(local_380,auVar53,0xd);
            uVar132 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar27._4_4_ = uVar132;
            auVar27._0_4_ = uVar132;
            auVar27._8_4_ = uVar132;
            auVar27._12_4_ = uVar132;
            auVar27._16_4_ = uVar132;
            auVar27._20_4_ = uVar132;
            auVar27._24_4_ = uVar132;
            auVar27._28_4_ = uVar132;
            uVar21 = vcmpps_avx512vl(local_380,auVar27,2);
            bVar63 = (byte)uVar138 & (byte)uVar21 & bVar63;
            if (bVar63 != 0) {
              uVar138 = vcmpps_avx512vl(auVar100,auVar94,4);
              bVar63 = bVar63 & (byte)uVar138;
              auVar190 = ZEXT3264(local_640);
              auVar189 = ZEXT3264(local_660);
              if (bVar63 != 0) {
                fVar167 = auVar89._0_4_ * fVar149;
                fVar166 = auVar89._4_4_ * fVar171;
                auVar52._4_4_ = fVar166;
                auVar52._0_4_ = fVar167;
                fVar169 = auVar89._8_4_ * fVar174;
                auVar52._8_4_ = fVar169;
                fVar64 = auVar89._12_4_ * fVar175;
                auVar52._12_4_ = fVar64;
                fVar65 = auVar89._16_4_ * 0.0;
                auVar52._16_4_ = fVar65;
                fVar124 = auVar89._20_4_ * 0.0;
                auVar52._20_4_ = fVar124;
                fVar125 = auVar89._24_4_ * 0.0;
                auVar52._24_4_ = fVar125;
                auVar52._28_4_ = auVar100._28_4_;
                auVar101 = vsubps_avx512vl(auVar98,auVar52);
                local_3c0._0_4_ =
                     (float)((uint)(bVar54 & 1) * (int)fVar167 |
                            (uint)!(bool)(bVar54 & 1) * auVar101._0_4_);
                bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
                local_3c0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar166 | (uint)!bVar12 * auVar101._4_4_);
                bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
                local_3c0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar169 | (uint)!bVar12 * auVar101._8_4_);
                bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
                local_3c0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar64 | (uint)!bVar12 * auVar101._12_4_);
                bVar12 = (bool)((byte)(uVar55 >> 4) & 1);
                local_3c0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar65 | (uint)!bVar12 * auVar101._16_4_);
                bVar12 = (bool)((byte)(uVar55 >> 5) & 1);
                local_3c0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar124 | (uint)!bVar12 * auVar101._20_4_);
                bVar12 = (bool)((byte)(uVar55 >> 6) & 1);
                local_3c0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar125 | (uint)!bVar12 * auVar101._24_4_);
                bVar12 = SUB81(uVar55 >> 7,0);
                local_3c0._28_4_ =
                     (float)((uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar101._28_4_);
                auVar100 = vsubps_avx(ZEXT1632(auVar84),auVar91);
                auVar79 = vfmadd213ps_fma(auVar100,local_3c0,auVar91);
                uVar132 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar28._4_4_ = uVar132;
                auVar28._0_4_ = uVar132;
                auVar28._8_4_ = uVar132;
                auVar28._12_4_ = uVar132;
                auVar28._16_4_ = uVar132;
                auVar28._20_4_ = uVar132;
                auVar28._24_4_ = uVar132;
                auVar28._28_4_ = uVar132;
                auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                              CONCAT48(auVar79._8_4_ + auVar79._8_4_
                                                                       ,CONCAT44(auVar79._4_4_ +
                                                                                 auVar79._4_4_,
                                                                                 auVar79._0_4_ +
                                                                                 auVar79._0_4_)))),
                                           auVar28);
                uVar138 = vcmpps_avx512vl(local_380,auVar100,6);
                if (((byte)uVar138 & bVar63) != 0) {
                  auVar144._0_4_ = auVar90._0_4_ * fVar149;
                  auVar144._4_4_ = auVar90._4_4_ * fVar171;
                  auVar144._8_4_ = auVar90._8_4_ * fVar174;
                  auVar144._12_4_ = auVar90._12_4_ * fVar175;
                  auVar144._16_4_ = auVar90._16_4_ * 0.0;
                  auVar144._20_4_ = auVar90._20_4_ * 0.0;
                  auVar144._24_4_ = auVar90._24_4_ * 0.0;
                  auVar144._28_4_ = 0;
                  auVar100 = vsubps_avx512vl(auVar98,auVar144);
                  auVar122._0_4_ =
                       (uint)(bVar54 & 1) * (int)auVar144._0_4_ |
                       (uint)!(bool)(bVar54 & 1) * auVar100._0_4_;
                  bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
                  auVar122._4_4_ =
                       (uint)bVar12 * (int)auVar144._4_4_ | (uint)!bVar12 * auVar100._4_4_;
                  bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
                  auVar122._8_4_ =
                       (uint)bVar12 * (int)auVar144._8_4_ | (uint)!bVar12 * auVar100._8_4_;
                  bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
                  auVar122._12_4_ =
                       (uint)bVar12 * (int)auVar144._12_4_ | (uint)!bVar12 * auVar100._12_4_;
                  bVar12 = (bool)((byte)(uVar55 >> 4) & 1);
                  auVar122._16_4_ =
                       (uint)bVar12 * (int)auVar144._16_4_ | (uint)!bVar12 * auVar100._16_4_;
                  bVar12 = (bool)((byte)(uVar55 >> 5) & 1);
                  auVar122._20_4_ =
                       (uint)bVar12 * (int)auVar144._20_4_ | (uint)!bVar12 * auVar100._20_4_;
                  bVar12 = (bool)((byte)(uVar55 >> 6) & 1);
                  auVar122._24_4_ =
                       (uint)bVar12 * (int)auVar144._24_4_ | (uint)!bVar12 * auVar100._24_4_;
                  auVar122._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar100._28_4_;
                  auVar29._8_4_ = 0x40000000;
                  auVar29._0_8_ = 0x4000000040000000;
                  auVar29._12_4_ = 0x40000000;
                  auVar29._16_4_ = 0x40000000;
                  auVar29._20_4_ = 0x40000000;
                  auVar29._24_4_ = 0x40000000;
                  auVar29._28_4_ = 0x40000000;
                  local_3a0 = vfmsub132ps_avx512vl(auVar122,auVar98,auVar29);
                  local_360 = (undefined4)lVar57;
                  local_350 = local_5f0._0_8_;
                  uStack_348 = local_5f0._8_8_;
                  local_340 = local_600._0_8_;
                  uStack_338 = local_600._8_8_;
                  local_330 = local_610._0_8_;
                  uStack_328 = local_610._8_8_;
                  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    bVar54 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar54 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar79 = vcvtsi2ss_avx512f(auVar191._0_16_,local_360);
                    fVar149 = auVar79._0_4_;
                    local_300[0] = (fVar149 + local_3c0._0_4_ + 0.0) * (float)local_440;
                    local_300[1] = (fVar149 + local_3c0._4_4_ + 1.0) * local_440._4_4_;
                    local_300[2] = (fVar149 + local_3c0._8_4_ + 2.0) * fStack_438;
                    local_300[3] = (fVar149 + local_3c0._12_4_ + 3.0) * fStack_434;
                    fStack_2f0 = (fVar149 + local_3c0._16_4_ + 4.0) * fStack_430;
                    fStack_2ec = (fVar149 + local_3c0._20_4_ + 5.0) * fStack_42c;
                    fStack_2e8 = (fVar149 + local_3c0._24_4_ + 6.0) * fStack_428;
                    fStack_2e4 = fVar149 + local_3c0._28_4_ + 7.0;
                    local_2e0 = local_3a0;
                    local_2c0 = local_380;
                    uVar55 = 0;
                    uVar56 = (ulong)((byte)uVar138 & bVar63);
                    for (uVar60 = uVar56; local_35c = iVar7, (uVar60 & 1) == 0;
                        uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                      uVar55 = uVar55 + 1;
                    }
                    while (auVar79 = auVar192._0_16_, uVar56 != 0) {
                      uVar132 = *(undefined4 *)(ray + k * 4 + 0x100);
                      fVar149 = local_300[uVar55];
                      auVar143._4_4_ = fVar149;
                      auVar143._0_4_ = fVar149;
                      auVar143._8_4_ = fVar149;
                      auVar143._12_4_ = fVar149;
                      local_200._16_4_ = fVar149;
                      local_200._0_16_ = auVar143;
                      local_200._20_4_ = fVar149;
                      local_200._24_4_ = fVar149;
                      local_200._28_4_ = fVar149;
                      local_1e0 = *(undefined4 *)(local_2e0 + uVar55 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar55 * 4)
                      ;
                      local_690.context = context->user;
                      fVar171 = 1.0 - fVar149;
                      auVar24._8_4_ = 0x80000000;
                      auVar24._0_8_ = 0x8000000080000000;
                      auVar24._12_4_ = 0x80000000;
                      auVar81 = vxorps_avx512vl(ZEXT416((uint)fVar171),auVar24);
                      auVar79 = ZEXT416((uint)(fVar149 * fVar171 * 4.0));
                      auVar84 = vfnmsub213ss_fma(auVar143,auVar143,auVar79);
                      auVar79 = vfmadd213ss_fma(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),
                                                auVar79);
                      fVar171 = fVar171 * auVar81._0_4_ * 0.5;
                      fVar174 = auVar84._0_4_ * 0.5;
                      fVar175 = auVar79._0_4_ * 0.5;
                      fVar149 = fVar149 * fVar149 * 0.5;
                      auVar163._0_4_ = fVar149 * (float)local_470._0_4_;
                      auVar163._4_4_ = fVar149 * (float)local_470._4_4_;
                      auVar163._8_4_ = fVar149 * fStack_468;
                      auVar163._12_4_ = fVar149 * fStack_464;
                      auVar136._4_4_ = fVar175;
                      auVar136._0_4_ = fVar175;
                      auVar136._8_4_ = fVar175;
                      auVar136._12_4_ = fVar175;
                      auVar79 = vfmadd132ps_fma(auVar136,auVar163,local_610);
                      auVar155._4_4_ = fVar174;
                      auVar155._0_4_ = fVar174;
                      auVar155._8_4_ = fVar174;
                      auVar155._12_4_ = fVar174;
                      auVar79 = vfmadd132ps_fma(auVar155,auVar79,local_600);
                      auVar137._4_4_ = fVar171;
                      auVar137._0_4_ = fVar171;
                      auVar137._8_4_ = fVar171;
                      auVar137._12_4_ = fVar171;
                      auVar79 = vfmadd132ps_fma(auVar137,auVar79,local_5f0);
                      local_260 = auVar79._0_4_;
                      auVar161._8_4_ = 1;
                      auVar161._0_8_ = 0x100000001;
                      auVar161._12_4_ = 1;
                      auVar161._16_4_ = 1;
                      auVar161._20_4_ = 1;
                      auVar161._24_4_ = 1;
                      auVar161._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar161,ZEXT1632(auVar79));
                      auVar165._8_4_ = 2;
                      auVar165._0_8_ = 0x200000002;
                      auVar165._12_4_ = 2;
                      auVar165._16_4_ = 2;
                      auVar165._20_4_ = 2;
                      auVar165._24_4_ = 2;
                      auVar165._28_4_ = 2;
                      local_220 = vpermps_avx2(auVar165,ZEXT1632(auVar79));
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_280._0_8_;
                      uStack_1b8 = local_280._8_8_;
                      uStack_1b0 = local_280._16_8_;
                      uStack_1a8 = local_280._24_8_;
                      local_1a0 = local_400;
                      vpcmpeqd_avx2(local_400,local_400);
                      local_180 = (local_690.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_690.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_560 = local_2a0;
                      local_690.valid = (int *)local_560;
                      local_690.geometryUserPtr = pGVar8->userPtr;
                      local_690.hit = (RTCHitN *)&local_260;
                      local_690.N = 8;
                      local_460._0_8_ = uVar55;
                      uVar60 = uVar55;
                      local_690.ray = (RTCRayN *)ray;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar8->occlusionFilterN)(&local_690);
                        uVar60 = local_460._0_8_;
                      }
                      if (local_560 != (undefined1  [32])0x0) {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var11)(&local_690);
                          uVar60 = local_460._0_8_;
                        }
                        auVar79 = auVar192._0_16_;
                        uVar55 = vptestmd_avx512vl(local_560,local_560);
                        auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar12 = (bool)((byte)uVar55 & 1);
                        auVar123._0_4_ =
                             (uint)bVar12 * auVar100._0_4_ |
                             (uint)!bVar12 * *(int *)(local_690.ray + 0x100);
                        bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
                        auVar123._4_4_ =
                             (uint)bVar12 * auVar100._4_4_ |
                             (uint)!bVar12 * *(int *)(local_690.ray + 0x104);
                        bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
                        auVar123._8_4_ =
                             (uint)bVar12 * auVar100._8_4_ |
                             (uint)!bVar12 * *(int *)(local_690.ray + 0x108);
                        bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
                        auVar123._12_4_ =
                             (uint)bVar12 * auVar100._12_4_ |
                             (uint)!bVar12 * *(int *)(local_690.ray + 0x10c);
                        bVar12 = (bool)((byte)(uVar55 >> 4) & 1);
                        auVar123._16_4_ =
                             (uint)bVar12 * auVar100._16_4_ |
                             (uint)!bVar12 * *(int *)(local_690.ray + 0x110);
                        bVar12 = (bool)((byte)(uVar55 >> 5) & 1);
                        auVar123._20_4_ =
                             (uint)bVar12 * auVar100._20_4_ |
                             (uint)!bVar12 * *(int *)(local_690.ray + 0x114);
                        bVar12 = (bool)((byte)(uVar55 >> 6) & 1);
                        auVar123._24_4_ =
                             (uint)bVar12 * auVar100._24_4_ |
                             (uint)!bVar12 * *(int *)(local_690.ray + 0x118);
                        bVar12 = SUB81(uVar55 >> 7,0);
                        auVar123._28_4_ =
                             (uint)bVar12 * auVar100._28_4_ |
                             (uint)!bVar12 * *(int *)(local_690.ray + 0x11c);
                        *(undefined1 (*) [32])(local_690.ray + 0x100) = auVar123;
                        if (local_560 != (undefined1  [32])0x0) {
                          bVar54 = 1;
                          goto LAB_018ec235;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar132;
                      uVar55 = 0;
                      uVar56 = uVar56 ^ 1L << (uVar60 & 0x3f);
                      for (uVar60 = uVar56; (uVar60 & 1) == 0;
                          uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                        uVar55 = uVar55 + 1;
                      }
                    }
                    bVar54 = 0;
LAB_018ec235:
                    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar191 = ZEXT3264(auVar100);
                    auVar79 = vxorps_avx512vl(auVar79,auVar79);
                    auVar192 = ZEXT1664(auVar79);
                    auVar193 = ZEXT3264(local_4e0);
                    auVar194 = ZEXT3264(local_4c0);
                    auVar190 = ZEXT3264(local_640);
                    auVar189 = ZEXT3264(local_660);
                    auVar195 = ZEXT3264(local_5a0);
                    auVar197 = ZEXT3264(local_500);
                    auVar196 = ZEXT3264(local_5c0);
                    auVar198 = ZEXT3264(local_5e0);
                  }
                  bVar59 = (bool)(bVar59 | bVar54);
                }
              }
              goto LAB_018ec214;
            }
          }
          auVar190 = ZEXT3264(local_640);
          auVar189 = ZEXT3264(local_660);
        }
LAB_018ec214:
      }
    }
    if (bVar59) break;
    uVar132 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar23._4_4_ = uVar132;
    auVar23._0_4_ = uVar132;
    auVar23._8_4_ = uVar132;
    auVar23._12_4_ = uVar132;
    uVar138 = vcmpps_avx512vl(local_3d0,auVar23,2);
  }
  return uVar61 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }